

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  int iVar12;
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  ulong uVar76;
  long lVar77;
  byte bVar78;
  ulong uVar79;
  long lVar80;
  Geometry *geometry;
  long lVar81;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ulong uVar82;
  uint uVar83;
  bool bVar84;
  bool bVar85;
  float fVar86;
  float fVar87;
  float fVar130;
  float fVar132;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar91 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar92 [16];
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined4 uVar136;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar148;
  float fVar149;
  float fVar156;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar155;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 in_ZMM4 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_634;
  RayQueryContext *local_630;
  Precalculations *local_628;
  Primitive *local_620;
  ulong local_618;
  ulong local_610;
  ulong local_608;
  undefined1 local_600 [16];
  RTCFilterFunctionNArguments local_5f0;
  undefined8 local_5c0;
  undefined4 local_5b8;
  float local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  uint local_5a4;
  uint local_5a0;
  ulong local_588;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined8 uStack_578;
  undefined1 local_570 [16];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_550;
  undefined4 uStack_54c;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined4 local_2c0;
  int local_2bc;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  byte local_270;
  float local_260 [4];
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined1 local_220 [32];
  undefined8 local_200;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [32];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar76 = (ulong)(byte)PVar11;
  fVar149 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  auVar91 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  fVar141 = fVar149 * (ray->dir).field_0.m128[0];
  fVar148 = fVar149 * auVar91._0_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar100 = vpmovsxbd_avx2(auVar90);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar88);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar109 = vpmovsxbd_avx2(auVar182);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar108 = vpmovsxbd_avx2(auVar6);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar101 = vpmovsxbd_avx2(auVar7);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar76 + 6);
  auVar102 = vpmovsxbd_avx2(auVar8);
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar82 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar107 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar82 + uVar76 + 6);
  auVar97 = vpmovsxbd_avx2(auVar10);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar103 = vcvtdq2ps_avx(auVar97);
  uVar79 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar79 + 6);
  auVar104 = vpmovsxbd_avx2(auVar89);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar177._4_4_ = fVar141;
  auVar177._0_4_ = fVar141;
  auVar177._8_4_ = fVar141;
  auVar177._12_4_ = fVar141;
  auVar177._16_4_ = fVar141;
  auVar177._20_4_ = fVar141;
  auVar177._24_4_ = fVar141;
  auVar177._28_4_ = fVar141;
  auVar93 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar98 = ZEXT1632(CONCAT412(fVar149 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar149 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar149 * (ray->dir).field_0.m128[1],fVar141))));
  auVar94 = vpermps_avx512vl(auVar93,auVar98);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar96 = vpermps_avx512vl(auVar95,auVar98);
  fVar141 = auVar96._0_4_;
  auVar187._0_4_ = fVar141 * auVar109._0_4_;
  fVar161 = auVar96._4_4_;
  auVar187._4_4_ = fVar161 * auVar109._4_4_;
  fVar162 = auVar96._8_4_;
  auVar187._8_4_ = fVar162 * auVar109._8_4_;
  fVar163 = auVar96._12_4_;
  auVar187._12_4_ = fVar163 * auVar109._12_4_;
  fVar154 = auVar96._16_4_;
  auVar187._16_4_ = fVar154 * auVar109._16_4_;
  fVar155 = auVar96._20_4_;
  auVar187._20_4_ = fVar155 * auVar109._20_4_;
  fVar156 = auVar96._24_4_;
  auVar187._28_36_ = in_ZMM4._28_36_;
  auVar187._24_4_ = fVar156 * auVar109._24_4_;
  auVar98._4_4_ = auVar102._4_4_ * fVar161;
  auVar98._0_4_ = auVar102._0_4_ * fVar141;
  auVar98._8_4_ = auVar102._8_4_ * fVar162;
  auVar98._12_4_ = auVar102._12_4_ * fVar163;
  auVar98._16_4_ = auVar102._16_4_ * fVar154;
  auVar98._20_4_ = auVar102._20_4_ * fVar155;
  auVar98._24_4_ = auVar102._24_4_ * fVar156;
  auVar98._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar104._4_4_ * fVar161;
  auVar97._0_4_ = auVar104._0_4_ * fVar141;
  auVar97._8_4_ = auVar104._8_4_ * fVar162;
  auVar97._12_4_ = auVar104._12_4_ * fVar163;
  auVar97._16_4_ = auVar104._16_4_ * fVar154;
  auVar97._20_4_ = auVar104._20_4_ * fVar155;
  auVar97._24_4_ = auVar104._24_4_ * fVar156;
  auVar97._28_4_ = auVar96._28_4_;
  auVar90 = vfmadd231ps_fma(auVar187._0_32_,auVar94,auVar99);
  auVar88 = vfmadd231ps_fma(auVar98,auVar94,auVar101);
  auVar182 = vfmadd231ps_fma(auVar97,auVar103,auVar94);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar177,auVar100);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar177,auVar108);
  auVar182 = vfmadd231ps_fma(ZEXT1632(auVar182),auVar107,auVar177);
  auVar178._4_4_ = fVar148;
  auVar178._0_4_ = fVar148;
  auVar178._8_4_ = fVar148;
  auVar178._12_4_ = fVar148;
  auVar178._16_4_ = fVar148;
  auVar178._20_4_ = fVar148;
  auVar178._24_4_ = fVar148;
  auVar178._28_4_ = fVar148;
  auVar98 = ZEXT1632(CONCAT412(fVar149 * auVar91._12_4_,
                               CONCAT48(fVar149 * auVar91._8_4_,
                                        CONCAT44(fVar149 * auVar91._4_4_,fVar148))));
  auVar97 = vpermps_avx512vl(auVar93,auVar98);
  auVar98 = vpermps_avx512vl(auVar95,auVar98);
  fVar149 = auVar98._0_4_;
  fVar141 = auVar98._4_4_;
  auVar93._4_4_ = fVar141 * auVar109._4_4_;
  auVar93._0_4_ = fVar149 * auVar109._0_4_;
  fVar161 = auVar98._8_4_;
  auVar93._8_4_ = fVar161 * auVar109._8_4_;
  fVar162 = auVar98._12_4_;
  auVar93._12_4_ = fVar162 * auVar109._12_4_;
  fVar163 = auVar98._16_4_;
  auVar93._16_4_ = fVar163 * auVar109._16_4_;
  fVar154 = auVar98._20_4_;
  auVar93._20_4_ = fVar154 * auVar109._20_4_;
  fVar155 = auVar98._24_4_;
  auVar93._24_4_ = fVar155 * auVar109._24_4_;
  auVar93._28_4_ = auVar109._28_4_;
  auVar106._0_4_ = auVar102._0_4_ * fVar149;
  auVar106._4_4_ = auVar102._4_4_ * fVar141;
  auVar106._8_4_ = auVar102._8_4_ * fVar161;
  auVar106._12_4_ = auVar102._12_4_ * fVar162;
  auVar106._16_4_ = auVar102._16_4_ * fVar163;
  auVar106._20_4_ = auVar102._20_4_ * fVar154;
  auVar106._24_4_ = auVar102._24_4_ * fVar155;
  auVar106._28_4_ = 0;
  auVar102._4_4_ = auVar104._4_4_ * fVar141;
  auVar102._0_4_ = auVar104._0_4_ * fVar149;
  auVar102._8_4_ = auVar104._8_4_ * fVar161;
  auVar102._12_4_ = auVar104._12_4_ * fVar162;
  auVar102._16_4_ = auVar104._16_4_ * fVar163;
  auVar102._20_4_ = auVar104._20_4_ * fVar154;
  auVar102._24_4_ = auVar104._24_4_ * fVar155;
  auVar102._28_4_ = auVar98._28_4_;
  auVar6 = vfmadd231ps_fma(auVar93,auVar97,auVar99);
  auVar7 = vfmadd231ps_fma(auVar106,auVar97,auVar101);
  auVar8 = vfmadd231ps_fma(auVar102,auVar97,auVar103);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar178,auVar100);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar178,auVar108);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar178,auVar107);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar170._16_4_ = 0x7fffffff;
  auVar170._20_4_ = 0x7fffffff;
  auVar170._24_4_ = 0x7fffffff;
  auVar170._28_4_ = 0x7fffffff;
  auVar100 = vandps_avx(auVar170,ZEXT1632(auVar90));
  auVar120._8_4_ = 0x219392ef;
  auVar120._0_8_ = 0x219392ef219392ef;
  auVar120._12_4_ = 0x219392ef;
  auVar120._16_4_ = 0x219392ef;
  auVar120._20_4_ = 0x219392ef;
  auVar120._24_4_ = 0x219392ef;
  auVar120._28_4_ = 0x219392ef;
  uVar82 = vcmpps_avx512vl(auVar100,auVar120,1);
  bVar85 = (bool)((byte)uVar82 & 1);
  auVar94._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._0_4_;
  bVar85 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._4_4_;
  bVar85 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._8_4_;
  bVar85 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar90._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(auVar170,ZEXT1632(auVar88));
  uVar82 = vcmpps_avx512vl(auVar100,auVar120,1);
  bVar85 = (bool)((byte)uVar82 & 1);
  auVar95._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar88._0_4_;
  bVar85 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar88._4_4_;
  bVar85 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar88._8_4_;
  bVar85 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar88._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar100 = vandps_avx(auVar170,ZEXT1632(auVar182));
  uVar82 = vcmpps_avx512vl(auVar100,auVar120,1);
  bVar85 = (bool)((byte)uVar82 & 1);
  auVar100._0_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar182._0_4_;
  bVar85 = (bool)((byte)(uVar82 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar182._4_4_;
  bVar85 = (bool)((byte)(uVar82 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar182._8_4_;
  bVar85 = (bool)((byte)(uVar82 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar85 * 0x219392ef | (uint)!bVar85 * auVar182._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar82 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar82 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar82 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar82 >> 7) * 0x219392ef;
  auVar99 = vrcp14ps_avx512vl(auVar94);
  auVar166._8_4_ = 0x3f800000;
  auVar166._0_8_ = &DAT_3f8000003f800000;
  auVar166._12_4_ = 0x3f800000;
  auVar166._16_4_ = 0x3f800000;
  auVar166._20_4_ = 0x3f800000;
  auVar166._24_4_ = 0x3f800000;
  auVar166._28_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar94,auVar99,auVar166);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar95);
  auVar88 = vfnmadd213ps_fma(auVar95,auVar99,auVar166);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar100);
  auVar182 = vfnmadd213ps_fma(auVar100,auVar99,auVar166);
  auVar182 = vfmadd132ps_fma(ZEXT1632(auVar182),auVar99,auVar99);
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar6));
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar107._4_4_ = auVar90._4_4_ * auVar100._4_4_;
  auVar107._0_4_ = auVar90._0_4_ * auVar100._0_4_;
  auVar107._8_4_ = auVar90._8_4_ * auVar100._8_4_;
  auVar107._12_4_ = auVar90._12_4_ * auVar100._12_4_;
  auVar107._16_4_ = auVar100._16_4_ * 0.0;
  auVar107._20_4_ = auVar100._20_4_ * 0.0;
  auVar107._24_4_ = auVar100._24_4_ * 0.0;
  auVar107._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar99);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar6));
  auVar119._0_4_ = auVar90._0_4_ * auVar100._0_4_;
  auVar119._4_4_ = auVar90._4_4_ * auVar100._4_4_;
  auVar119._8_4_ = auVar90._8_4_ * auVar100._8_4_;
  auVar119._12_4_ = auVar90._12_4_ * auVar100._12_4_;
  auVar119._16_4_ = auVar100._16_4_ * 0.0;
  auVar119._20_4_ = auVar100._20_4_ * 0.0;
  auVar119._24_4_ = auVar100._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar76 * -2 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar7));
  auVar103._4_4_ = auVar88._4_4_ * auVar100._4_4_;
  auVar103._0_4_ = auVar88._0_4_ * auVar100._0_4_;
  auVar103._8_4_ = auVar88._8_4_ * auVar100._8_4_;
  auVar103._12_4_ = auVar88._12_4_ * auVar100._12_4_;
  auVar103._16_4_ = auVar100._16_4_ * 0.0;
  auVar103._20_4_ = auVar100._20_4_ * 0.0;
  auVar103._24_4_ = auVar100._24_4_ * 0.0;
  auVar103._28_4_ = auVar100._28_4_;
  auVar100 = vcvtdq2ps_avx(auVar99);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar7));
  auVar105._0_4_ = auVar88._0_4_ * auVar100._0_4_;
  auVar105._4_4_ = auVar88._4_4_ * auVar100._4_4_;
  auVar105._8_4_ = auVar88._8_4_ * auVar100._8_4_;
  auVar105._12_4_ = auVar88._12_4_ * auVar100._12_4_;
  auVar105._16_4_ = auVar100._16_4_ * 0.0;
  auVar105._20_4_ = auVar100._20_4_ * 0.0;
  auVar105._24_4_ = auVar100._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 + uVar76 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar8));
  auVar104._4_4_ = auVar100._4_4_ * auVar182._4_4_;
  auVar104._0_4_ = auVar100._0_4_ * auVar182._0_4_;
  auVar104._8_4_ = auVar100._8_4_ * auVar182._8_4_;
  auVar104._12_4_ = auVar100._12_4_ * auVar182._12_4_;
  auVar104._16_4_ = auVar100._16_4_ * 0.0;
  auVar104._20_4_ = auVar100._20_4_ * 0.0;
  auVar104._24_4_ = auVar100._24_4_ * 0.0;
  auVar104._28_4_ = auVar100._28_4_;
  auVar100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x17 + 6));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar100 = vsubps_avx(auVar100,ZEXT1632(auVar8));
  auVar96._0_4_ = auVar182._0_4_ * auVar100._0_4_;
  auVar96._4_4_ = auVar182._4_4_ * auVar100._4_4_;
  auVar96._8_4_ = auVar182._8_4_ * auVar100._8_4_;
  auVar96._12_4_ = auVar182._12_4_ * auVar100._12_4_;
  auVar96._16_4_ = auVar100._16_4_ * 0.0;
  auVar96._20_4_ = auVar100._20_4_ * 0.0;
  auVar96._24_4_ = auVar100._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar100 = vpminsd_avx2(auVar107,auVar119);
  auVar99 = vpminsd_avx2(auVar103,auVar105);
  auVar100 = vmaxps_avx(auVar100,auVar99);
  auVar99 = vpminsd_avx2(auVar104,auVar96);
  uVar136 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar109._4_4_ = uVar136;
  auVar109._0_4_ = uVar136;
  auVar109._8_4_ = uVar136;
  auVar109._12_4_ = uVar136;
  auVar109._16_4_ = uVar136;
  auVar109._20_4_ = uVar136;
  auVar109._24_4_ = uVar136;
  auVar109._28_4_ = uVar136;
  auVar99 = vmaxps_avx512vl(auVar99,auVar109);
  auVar100 = vmaxps_avx(auVar100,auVar99);
  auVar99._8_4_ = 0x3f7ffffa;
  auVar99._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar99._12_4_ = 0x3f7ffffa;
  auVar99._16_4_ = 0x3f7ffffa;
  auVar99._20_4_ = 0x3f7ffffa;
  auVar99._24_4_ = 0x3f7ffffa;
  auVar99._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar100,auVar99);
  auVar100 = vpmaxsd_avx2(auVar107,auVar119);
  auVar99 = vpmaxsd_avx2(auVar103,auVar105);
  auVar100 = vminps_avx(auVar100,auVar99);
  auVar99 = vpmaxsd_avx2(auVar104,auVar96);
  fVar149 = ray->tfar;
  auVar108._4_4_ = fVar149;
  auVar108._0_4_ = fVar149;
  auVar108._8_4_ = fVar149;
  auVar108._12_4_ = fVar149;
  auVar108._16_4_ = fVar149;
  auVar108._20_4_ = fVar149;
  auVar108._24_4_ = fVar149;
  auVar108._28_4_ = fVar149;
  auVar99 = vminps_avx512vl(auVar99,auVar108);
  auVar100 = vminps_avx(auVar100,auVar99);
  auVar101._8_4_ = 0x3f800003;
  auVar101._0_8_ = 0x3f8000033f800003;
  auVar101._12_4_ = 0x3f800003;
  auVar101._16_4_ = 0x3f800003;
  auVar101._20_4_ = 0x3f800003;
  auVar101._24_4_ = 0x3f800003;
  auVar101._28_4_ = 0x3f800003;
  auVar100 = vmulps_avx512vl(auVar100,auVar101);
  auVar99 = vpbroadcastd_avx512vl();
  uVar23 = vpcmpgtd_avx512vl(auVar99,_DAT_0205a920);
  uVar22 = vcmpps_avx512vl(local_80,auVar100,2);
  bVar85 = (byte)((byte)uVar22 & (byte)uVar23) != 0;
  if (bVar85) {
    uVar82 = (ulong)(byte)((byte)uVar22 & (byte)uVar23);
    do {
      lVar81 = 0;
      for (uVar76 = uVar82; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
        lVar81 = lVar81 + 1;
      }
      local_608 = (ulong)*(uint *)(prim + 2);
      local_588 = (ulong)*(uint *)(prim + lVar81 * 4 + 6);
      pGVar13 = (context->scene->geometries).items[local_608].ptr;
      uVar76 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                               local_588 *
                               pGVar13[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar77 = (long)pGVar13[1].intersectionFilterN * uVar76;
      lVar80 = (long)pGVar13[1].intersectionFilterN * (uVar76 + 1);
      iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar69 = (long)iVar12 * 0x44;
      lVar81 = *(long *)&pGVar13[1].time_range.upper;
      local_570 = *(undefined1 (*) [16])(lVar81 + lVar77);
      local_3b0 = *(undefined1 (*) [16])(lVar81 + lVar80);
      auVar91._8_4_ = 0xbeaaaaab;
      auVar91._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar91._12_4_ = 0xbeaaaaab;
      local_390 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar13[2].intersectionFilterN +
                                    uVar76 * (long)pGVar13[2].pointQueryFunc),local_570,auVar91);
      local_3a0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar13[2].intersectionFilterN +
                                   (long)pGVar13[2].pointQueryFunc * (uVar76 + 1)),local_3b0,auVar91
                                 );
      aVar3 = (ray->org).field_0;
      auVar88 = vsubps_avx(local_570,(undefined1  [16])aVar3);
      uVar136 = auVar88._0_4_;
      auVar142._4_4_ = uVar136;
      auVar142._0_4_ = uVar136;
      auVar142._8_4_ = uVar136;
      auVar142._12_4_ = uVar136;
      auVar90 = vshufps_avx(auVar88,auVar88,0x55);
      aVar4 = (pre->ray_space).vx.field_0;
      aVar5 = (pre->ray_space).vy.field_0;
      fVar149 = (pre->ray_space).vz.field_0.m128[0];
      fVar141 = (pre->ray_space).vz.field_0.m128[1];
      fVar161 = (pre->ray_space).vz.field_0.m128[2];
      fVar162 = (pre->ray_space).vz.field_0.m128[3];
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar174._0_4_ = auVar88._0_4_ * fVar149;
      auVar174._4_4_ = auVar88._4_4_ * fVar141;
      auVar174._8_4_ = auVar88._8_4_ * fVar161;
      auVar174._12_4_ = auVar88._12_4_ * fVar162;
      auVar90 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar90);
      auVar182 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar142);
      auVar88 = vsubps_avx(local_390,(undefined1  [16])aVar3);
      uVar136 = auVar88._0_4_;
      auVar143._4_4_ = uVar136;
      auVar143._0_4_ = uVar136;
      auVar143._8_4_ = uVar136;
      auVar143._12_4_ = uVar136;
      auVar90 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar175._0_4_ = auVar88._0_4_ * fVar149;
      auVar175._4_4_ = auVar88._4_4_ * fVar141;
      auVar175._8_4_ = auVar88._8_4_ * fVar161;
      auVar175._12_4_ = auVar88._12_4_ * fVar162;
      auVar90 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar5,auVar90);
      auVar6 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar143);
      auVar88 = vsubps_avx(local_3a0,(undefined1  [16])aVar3);
      uVar136 = auVar88._0_4_;
      auVar92._4_4_ = uVar136;
      auVar92._0_4_ = uVar136;
      auVar92._8_4_ = uVar136;
      auVar92._12_4_ = uVar136;
      auVar90 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar176._0_4_ = auVar88._0_4_ * fVar149;
      auVar176._4_4_ = auVar88._4_4_ * fVar141;
      auVar176._8_4_ = auVar88._8_4_ * fVar161;
      auVar176._12_4_ = auVar88._12_4_ * fVar162;
      auVar90 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar90);
      auVar7 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar92);
      auVar88 = vsubps_avx(local_3b0,(undefined1  [16])aVar3);
      uVar136 = auVar88._0_4_;
      auVar140._4_4_ = uVar136;
      auVar140._0_4_ = uVar136;
      auVar140._8_4_ = uVar136;
      auVar140._12_4_ = uVar136;
      auVar90 = vshufps_avx(auVar88,auVar88,0x55);
      auVar88 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar179._0_4_ = auVar88._0_4_ * fVar149;
      auVar179._4_4_ = auVar88._4_4_ * fVar141;
      auVar179._8_4_ = auVar88._8_4_ * fVar161;
      auVar179._12_4_ = auVar88._12_4_ * fVar162;
      auVar90 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar90);
      auVar8 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar4,auVar140);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar69);
      uVar136 = auVar182._0_4_;
      local_3e0._4_4_ = uVar136;
      local_3e0._0_4_ = uVar136;
      local_3e0._8_4_ = uVar136;
      local_3e0._12_4_ = uVar136;
      local_3e0._16_4_ = uVar136;
      local_3e0._20_4_ = uVar136;
      local_3e0._24_4_ = uVar136;
      local_3e0._28_4_ = uVar136;
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x484);
      auVar137._8_4_ = 1;
      auVar137._0_8_ = 0x100000001;
      auVar137._12_4_ = 1;
      auVar137._16_4_ = 1;
      auVar137._20_4_ = 1;
      auVar137._24_4_ = 1;
      auVar137._28_4_ = 1;
      local_340 = vpermps_avx512vl(auVar137,ZEXT1632(auVar182));
      local_400 = vbroadcastss_avx512vl(auVar6);
      local_420 = vpermps_avx512vl(auVar137,ZEXT1632(auVar6));
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x908);
      local_480 = vbroadcastss_avx512vl(auVar7);
      auVar187 = ZEXT3264(local_480);
      local_4a0 = vpermps_avx512vl(auVar137,ZEXT1632(auVar7));
      auVar188 = ZEXT3264(local_4a0);
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0xd8c);
      local_4c0 = vbroadcastss_avx512vl(auVar8);
      auVar189 = ZEXT3264(local_4c0);
      local_4e0 = vpermps_avx512vl(auVar137,ZEXT1632(auVar8));
      auVar190 = ZEXT3264(local_4e0);
      auVar101 = vmulps_avx512vl(local_4c0,auVar108);
      auVar102 = vmulps_avx512vl(local_4e0,auVar108);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar109,local_480);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar109,local_4a0);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,local_400);
      auVar103 = vfmadd231ps_avx512vl(auVar102,auVar99,local_420);
      auVar9 = vfmadd231ps_fma(auVar101,auVar100,local_3e0);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar69);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x484);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x908);
      auVar104 = vfmadd231ps_avx512vl(auVar103,auVar100,local_340);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0xd8c);
      auVar97 = vmulps_avx512vl(local_4c0,auVar103);
      auVar98 = vmulps_avx512vl(local_4e0,auVar103);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar107,local_480);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_4a0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_400);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_420);
      auVar10 = vfmadd231ps_fma(auVar97,auVar101,local_3e0);
      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar101,local_340);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar9));
      auVar93 = vsubps_avx512vl(auVar97,auVar104);
      auVar94 = vmulps_avx512vl(auVar104,auVar98);
      auVar95 = vmulps_avx512vl(ZEXT1632(auVar9),auVar93);
      auVar94 = vsubps_avx512vl(auVar94,auVar95);
      auVar90 = vshufps_avx(local_390,local_390,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar90);
      auVar90 = vshufps_avx(local_3a0,local_3a0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar90);
      _local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar81 + 0xc + lVar80)));
      auVar95 = vmulps_avx512vl(_local_e0,auVar108);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,local_c0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,local_a0);
      local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar81 + 0xc + lVar77)));
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_100);
      auVar96 = vmulps_avx512vl(_local_e0,auVar103);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,local_c0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_a0);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_100);
      auVar105 = vmulps_avx512vl(auVar93,auVar93);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar98,auVar98);
      auVar106 = vmaxps_avx512vl(auVar95,auVar96);
      auVar106 = vmulps_avx512vl(auVar106,auVar106);
      auVar105 = vmulps_avx512vl(auVar106,auVar105);
      auVar94 = vmulps_avx512vl(auVar94,auVar94);
      uVar22 = vcmpps_avx512vl(auVar94,auVar105,2);
      auVar90 = vinsertps_avx512f(auVar182,local_100._0_16_,0x30);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar89 = vandps_avx512vl(auVar90,auVar88);
      auVar90 = vblendps_avx(auVar6,local_390,8);
      auVar90 = vandps_avx512vl(auVar90,auVar88);
      auVar89 = vmaxps_avx512vl(auVar89,auVar90);
      auVar90 = vblendps_avx(auVar7,local_3a0,8);
      auVar91 = vandps_avx512vl(auVar90,auVar88);
      auVar90 = vinsertps_avx512f(auVar8,local_e0._0_16_,0x30);
      auVar90 = vandps_avx512vl(auVar90,auVar88);
      auVar90 = vmaxps_avx512vl(auVar91,auVar90);
      auVar90 = vmaxps_avx(auVar89,auVar90);
      auVar88 = vmovshdup_avx(auVar90);
      auVar88 = vmaxss_avx(auVar88,auVar90);
      auVar90 = vshufpd_avx(auVar90,auVar90,1);
      auVar90 = vmaxss_avx(auVar90,auVar88);
      local_600._0_4_ = (undefined4)iVar12;
      local_600._4_12_ = auVar182._4_12_;
      auVar172._4_4_ = local_600._0_4_;
      auVar172._0_4_ = local_600._0_4_;
      auVar172._8_4_ = local_600._0_4_;
      auVar172._12_4_ = local_600._0_4_;
      auVar172._16_4_ = local_600._0_4_;
      auVar172._20_4_ = local_600._0_4_;
      auVar172._24_4_ = local_600._0_4_;
      auVar172._28_4_ = local_600._0_4_;
      uVar23 = vcmpps_avx512vl(auVar172,_DAT_02020f40,0xe);
      local_270 = (byte)uVar22 & (byte)uVar23;
      auVar90 = vmulss_avx512f(auVar90,ZEXT416(0x35000000));
      auVar171._8_4_ = 2;
      auVar171._0_8_ = 0x200000002;
      auVar171._12_4_ = 2;
      auVar171._16_4_ = 2;
      auVar171._20_4_ = 2;
      auVar171._24_4_ = 2;
      auVar171._28_4_ = 2;
      local_360 = vpermps_avx512vl(auVar171,ZEXT1632(auVar182));
      auVar191 = ZEXT3264(local_360);
      local_380 = vpermps_avx512vl(auVar171,ZEXT1632(auVar6));
      auVar192 = ZEXT3264(local_380);
      local_120 = vpermps_avx512vl(auVar171,ZEXT1632(auVar7));
      local_140 = vpermps_avx512vl(auVar171,ZEXT1632(auVar8));
      uVar136 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
      local_1c0 = auVar90._0_4_;
      uStack_1bc = auVar90._4_4_;
      uStack_1b8 = auVar90._8_4_;
      uStack_1b4 = auVar90._12_4_;
      auVar88 = auVar103._0_16_;
      if (local_270 == 0) {
        bVar84 = false;
        auVar90 = vxorps_avx512vl(auVar88,auVar88);
        auVar183 = ZEXT1664(auVar90);
        auVar186 = ZEXT3264(local_3e0);
        auVar193 = ZEXT3264(local_340);
        auVar185 = ZEXT3264(local_400);
        auVar181 = ZEXT3264(local_420);
      }
      else {
        uStack_4fc = 0;
        uStack_4f8 = 0;
        uStack_4f4 = 0;
        auVar103 = vmulps_avx512vl(local_140,auVar103);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar103);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_380,auVar107);
        auVar102 = vfmadd213ps_avx512vl(auVar101,local_360,auVar102);
        auVar108 = vmulps_avx512vl(local_140,auVar108);
        auVar109 = vfmadd213ps_avx512vl(auVar109,local_120,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar99,local_380,auVar109);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1694);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 + 0x1f9c);
        auVar107 = vfmadd213ps_avx512vl(auVar100,local_360,auVar107);
        auVar100 = vmulps_avx512vl(local_4c0,auVar101);
        auVar103 = vmulps_avx512vl(local_4e0,auVar101);
        auVar101 = vmulps_avx512vl(local_140,auVar101);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,local_480);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_4a0);
        auVar108 = vfmadd231ps_avx512vl(auVar101,local_120,auVar108);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,local_400);
        auVar101 = vfmadd231ps_avx512vl(auVar103,auVar109,local_420);
        auVar103 = vfmadd231ps_avx512vl(auVar108,local_380,auVar109);
        auVar94 = vfmadd231ps_avx512vl(auVar100,auVar99,local_3e0);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,local_340);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1210);
        auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1b18);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1f9c);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_360,auVar99);
        auVar99 = vmulps_avx512vl(local_4c0,auVar108);
        auVar105 = vmulps_avx512vl(local_4e0,auVar108);
        auVar108 = vmulps_avx512vl(local_140,auVar108);
        auVar106 = vfmadd231ps_avx512vl(auVar99,auVar109,local_480);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar109,local_4a0);
        auVar109 = vfmadd231ps_avx512vl(auVar108,local_120,auVar109);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 + 0x1694);
        auVar108 = vfmadd231ps_avx512vl(auVar106,auVar99,local_400);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar99,local_420);
        auVar99 = vfmadd231ps_avx512vl(auVar109,local_380,auVar99);
        auVar109 = vfmadd231ps_avx512vl(auVar108,auVar100,local_3e0);
        auVar108 = vfmadd231ps_avx512vl(auVar105,auVar100,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar99,local_360,auVar100);
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar94,auVar105);
        vandps_avx512vl(auVar101,auVar105);
        auVar100 = vmaxps_avx(auVar105,auVar105);
        vandps_avx512vl(auVar103,auVar105);
        auVar100 = vmaxps_avx(auVar100,auVar105);
        auVar103 = vbroadcastss_avx512vl(auVar90);
        uVar76 = vcmpps_avx512vl(auVar100,auVar103,1);
        bVar84 = (bool)((byte)uVar76 & 1);
        auVar110._0_4_ = (float)((uint)bVar84 * auVar98._0_4_ | (uint)!bVar84 * auVar94._0_4_);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar84 * auVar98._4_4_ | (uint)!bVar84 * auVar94._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar84 * auVar98._8_4_ | (uint)!bVar84 * auVar94._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar84 * auVar98._12_4_ | (uint)!bVar84 * auVar94._12_4_);
        bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar84 * auVar98._16_4_ | (uint)!bVar84 * auVar94._16_4_);
        bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar84 * auVar98._20_4_ | (uint)!bVar84 * auVar94._20_4_);
        bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar84 * auVar98._24_4_ | (uint)!bVar84 * auVar94._24_4_);
        bVar84 = SUB81(uVar76 >> 7,0);
        auVar110._28_4_ = (uint)bVar84 * auVar98._28_4_ | (uint)!bVar84 * auVar94._28_4_;
        bVar84 = (bool)((byte)uVar76 & 1);
        auVar111._0_4_ = (float)((uint)bVar84 * auVar93._0_4_ | (uint)!bVar84 * auVar101._0_4_);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar84 * auVar93._4_4_ | (uint)!bVar84 * auVar101._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar84 * auVar93._8_4_ | (uint)!bVar84 * auVar101._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar84 * auVar93._12_4_ | (uint)!bVar84 * auVar101._12_4_);
        bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar84 * auVar93._16_4_ | (uint)!bVar84 * auVar101._16_4_);
        bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar84 * auVar93._20_4_ | (uint)!bVar84 * auVar101._20_4_);
        bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar84 * auVar93._24_4_ | (uint)!bVar84 * auVar101._24_4_);
        bVar84 = SUB81(uVar76 >> 7,0);
        auVar111._28_4_ = (uint)bVar84 * auVar93._28_4_ | (uint)!bVar84 * auVar101._28_4_;
        vandps_avx512vl(auVar109,auVar105);
        vandps_avx512vl(auVar108,auVar105);
        auVar100 = vmaxps_avx(auVar111,auVar111);
        vandps_avx512vl(auVar99,auVar105);
        auVar100 = vmaxps_avx(auVar100,auVar111);
        uVar76 = vcmpps_avx512vl(auVar100,auVar103,1);
        bVar84 = (bool)((byte)uVar76 & 1);
        auVar112._0_4_ = (float)((uint)bVar84 * auVar98._0_4_ | (uint)!bVar84 * auVar109._0_4_);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar84 * auVar98._4_4_ | (uint)!bVar84 * auVar109._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar84 * auVar98._8_4_ | (uint)!bVar84 * auVar109._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar84 * auVar98._12_4_ | (uint)!bVar84 * auVar109._12_4_);
        bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar84 * auVar98._16_4_ | (uint)!bVar84 * auVar109._16_4_);
        bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar84 * auVar98._20_4_ | (uint)!bVar84 * auVar109._20_4_);
        bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar84 * auVar98._24_4_ | (uint)!bVar84 * auVar109._24_4_);
        bVar84 = SUB81(uVar76 >> 7,0);
        auVar112._28_4_ = (uint)bVar84 * auVar98._28_4_ | (uint)!bVar84 * auVar109._28_4_;
        bVar84 = (bool)((byte)uVar76 & 1);
        auVar113._0_4_ = (float)((uint)bVar84 * auVar93._0_4_ | (uint)!bVar84 * auVar108._0_4_);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar84 * auVar93._4_4_ | (uint)!bVar84 * auVar108._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar84 * auVar93._8_4_ | (uint)!bVar84 * auVar108._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar84 * auVar93._12_4_ | (uint)!bVar84 * auVar108._12_4_);
        bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar84 * auVar93._16_4_ | (uint)!bVar84 * auVar108._16_4_);
        bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar84 * auVar93._20_4_ | (uint)!bVar84 * auVar108._20_4_);
        bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar84 * auVar93._24_4_ | (uint)!bVar84 * auVar108._24_4_);
        bVar84 = SUB81(uVar76 >> 7,0);
        auVar113._28_4_ = (uint)bVar84 * auVar93._28_4_ | (uint)!bVar84 * auVar108._28_4_;
        auVar92 = vxorps_avx512vl(auVar88,auVar88);
        auVar183 = ZEXT1664(auVar92);
        auVar100 = vfmadd213ps_avx512vl(auVar110,auVar110,ZEXT1632(auVar92));
        auVar90 = vfmadd231ps_fma(auVar100,auVar111,auVar111);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar108 = vmulps_avx512vl(ZEXT1632(auVar90),auVar109);
        fVar149 = auVar100._0_4_;
        fVar141 = auVar100._4_4_;
        fVar161 = auVar100._8_4_;
        fVar162 = auVar100._12_4_;
        fVar163 = auVar100._16_4_;
        fVar154 = auVar100._20_4_;
        fVar155 = auVar100._24_4_;
        auVar33._4_4_ = fVar141 * fVar141 * fVar141 * auVar108._4_4_;
        auVar33._0_4_ = fVar149 * fVar149 * fVar149 * auVar108._0_4_;
        auVar33._8_4_ = fVar161 * fVar161 * fVar161 * auVar108._8_4_;
        auVar33._12_4_ = fVar162 * fVar162 * fVar162 * auVar108._12_4_;
        auVar33._16_4_ = fVar163 * fVar163 * fVar163 * auVar108._16_4_;
        auVar33._20_4_ = fVar154 * fVar154 * fVar154 * auVar108._20_4_;
        auVar33._24_4_ = fVar155 * fVar155 * fVar155 * auVar108._24_4_;
        auVar33._28_4_ = auVar99._28_4_;
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar100 = vfmadd231ps_avx512vl(auVar33,auVar99,auVar100);
        auVar34._4_4_ = auVar111._4_4_ * auVar100._4_4_;
        auVar34._0_4_ = auVar111._0_4_ * auVar100._0_4_;
        auVar34._8_4_ = auVar111._8_4_ * auVar100._8_4_;
        auVar34._12_4_ = auVar111._12_4_ * auVar100._12_4_;
        auVar34._16_4_ = auVar111._16_4_ * auVar100._16_4_;
        auVar34._20_4_ = auVar111._20_4_ * auVar100._20_4_;
        auVar34._24_4_ = auVar111._24_4_ * auVar100._24_4_;
        auVar34._28_4_ = auVar108._28_4_;
        auVar35._4_4_ = auVar100._4_4_ * -auVar110._4_4_;
        auVar35._0_4_ = auVar100._0_4_ * -auVar110._0_4_;
        auVar35._8_4_ = auVar100._8_4_ * -auVar110._8_4_;
        auVar35._12_4_ = auVar100._12_4_ * -auVar110._12_4_;
        auVar35._16_4_ = auVar100._16_4_ * -auVar110._16_4_;
        auVar35._20_4_ = auVar100._20_4_ * -auVar110._20_4_;
        auVar35._24_4_ = auVar100._24_4_ * -auVar110._24_4_;
        auVar35._28_4_ = auVar111._28_4_;
        auVar108 = vmulps_avx512vl(auVar100,ZEXT1632(auVar92));
        auVar103 = ZEXT1632(auVar92);
        auVar101 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar103);
        auVar90 = vfmadd231ps_fma(auVar101,auVar113,auVar113);
        auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
        auVar109 = vmulps_avx512vl(ZEXT1632(auVar90),auVar109);
        fVar149 = auVar101._0_4_;
        fVar141 = auVar101._4_4_;
        fVar161 = auVar101._8_4_;
        fVar162 = auVar101._12_4_;
        fVar163 = auVar101._16_4_;
        fVar154 = auVar101._20_4_;
        fVar155 = auVar101._24_4_;
        auVar36._4_4_ = fVar141 * fVar141 * fVar141 * auVar109._4_4_;
        auVar36._0_4_ = fVar149 * fVar149 * fVar149 * auVar109._0_4_;
        auVar36._8_4_ = fVar161 * fVar161 * fVar161 * auVar109._8_4_;
        auVar36._12_4_ = fVar162 * fVar162 * fVar162 * auVar109._12_4_;
        auVar36._16_4_ = fVar163 * fVar163 * fVar163 * auVar109._16_4_;
        auVar36._20_4_ = fVar154 * fVar154 * fVar154 * auVar109._20_4_;
        auVar36._24_4_ = fVar155 * fVar155 * fVar155 * auVar109._24_4_;
        auVar36._28_4_ = auVar100._28_4_;
        auVar100 = vfmadd231ps_avx512vl(auVar36,auVar99,auVar101);
        auVar37._4_4_ = auVar113._4_4_ * auVar100._4_4_;
        auVar37._0_4_ = auVar113._0_4_ * auVar100._0_4_;
        auVar37._8_4_ = auVar113._8_4_ * auVar100._8_4_;
        auVar37._12_4_ = auVar113._12_4_ * auVar100._12_4_;
        auVar37._16_4_ = auVar113._16_4_ * auVar100._16_4_;
        auVar37._20_4_ = auVar113._20_4_ * auVar100._20_4_;
        auVar37._24_4_ = auVar113._24_4_ * auVar100._24_4_;
        auVar37._28_4_ = auVar109._28_4_;
        auVar38._4_4_ = auVar100._4_4_ * -auVar112._4_4_;
        auVar38._0_4_ = auVar100._0_4_ * -auVar112._0_4_;
        auVar38._8_4_ = auVar100._8_4_ * -auVar112._8_4_;
        auVar38._12_4_ = auVar100._12_4_ * -auVar112._12_4_;
        auVar38._16_4_ = auVar100._16_4_ * -auVar112._16_4_;
        auVar38._20_4_ = auVar100._20_4_ * -auVar112._20_4_;
        auVar38._24_4_ = auVar100._24_4_ * -auVar112._24_4_;
        auVar38._28_4_ = auVar101._28_4_;
        auVar100 = vmulps_avx512vl(auVar100,auVar103);
        auVar90 = vfmadd213ps_fma(auVar34,auVar95,ZEXT1632(auVar9));
        auVar88 = vfmadd213ps_fma(auVar35,auVar95,auVar104);
        auVar109 = vfmadd213ps_avx512vl(auVar108,auVar95,auVar107);
        auVar101 = vfmadd213ps_avx512vl(auVar37,auVar96,ZEXT1632(auVar10));
        auVar89 = vfnmadd213ps_fma(auVar34,auVar95,ZEXT1632(auVar9));
        auVar182 = vfmadd213ps_fma(auVar38,auVar96,auVar97);
        auVar91 = vfnmadd213ps_fma(auVar35,auVar95,auVar104);
        auVar6 = vfmadd213ps_fma(auVar100,auVar96,auVar102);
        auVar142 = vfnmadd231ps_fma(auVar107,auVar95,auVar108);
        auVar10 = vfnmadd213ps_fma(auVar37,auVar96,ZEXT1632(auVar10));
        auVar140 = vfnmadd213ps_fma(auVar38,auVar96,auVar97);
        auVar143 = vfnmadd231ps_fma(auVar102,auVar96,auVar100);
        auVar102 = vsubps_avx512vl(auVar101,ZEXT1632(auVar89));
        auVar100 = vsubps_avx(ZEXT1632(auVar182),ZEXT1632(auVar91));
        auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar142));
        auVar39._4_4_ = auVar100._4_4_ * auVar142._4_4_;
        auVar39._0_4_ = auVar100._0_4_ * auVar142._0_4_;
        auVar39._8_4_ = auVar100._8_4_ * auVar142._8_4_;
        auVar39._12_4_ = auVar100._12_4_ * auVar142._12_4_;
        auVar39._16_4_ = auVar100._16_4_ * 0.0;
        auVar39._20_4_ = auVar100._20_4_ * 0.0;
        auVar39._24_4_ = auVar100._24_4_ * 0.0;
        auVar39._28_4_ = auVar108._28_4_;
        auVar7 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar91),auVar99);
        auVar40._4_4_ = auVar99._4_4_ * auVar89._4_4_;
        auVar40._0_4_ = auVar99._0_4_ * auVar89._0_4_;
        auVar40._8_4_ = auVar99._8_4_ * auVar89._8_4_;
        auVar40._12_4_ = auVar99._12_4_ * auVar89._12_4_;
        auVar40._16_4_ = auVar99._16_4_ * 0.0;
        auVar40._20_4_ = auVar99._20_4_ * 0.0;
        auVar40._24_4_ = auVar99._24_4_ * 0.0;
        auVar40._28_4_ = auVar99._28_4_;
        auVar8 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar142),auVar102);
        auVar41._4_4_ = auVar91._4_4_ * auVar102._4_4_;
        auVar41._0_4_ = auVar91._0_4_ * auVar102._0_4_;
        auVar41._8_4_ = auVar91._8_4_ * auVar102._8_4_;
        auVar41._12_4_ = auVar91._12_4_ * auVar102._12_4_;
        auVar41._16_4_ = auVar102._16_4_ * 0.0;
        auVar41._20_4_ = auVar102._20_4_ * 0.0;
        auVar41._24_4_ = auVar102._24_4_ * 0.0;
        auVar41._28_4_ = auVar102._28_4_;
        auVar9 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar89),auVar100);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar103,ZEXT1632(auVar8));
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,ZEXT1632(auVar7));
        auVar93 = ZEXT1632(auVar92);
        uVar76 = vcmpps_avx512vl(auVar100,auVar93,2);
        bVar78 = (byte)uVar76;
        fVar86 = (float)((uint)(bVar78 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar10._0_4_);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar130 = (float)((uint)bVar84 * auVar90._4_4_ | (uint)!bVar84 * auVar10._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar132 = (float)((uint)bVar84 * auVar90._8_4_ | (uint)!bVar84 * auVar10._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar134 = (float)((uint)bVar84 * auVar90._12_4_ | (uint)!bVar84 * auVar10._12_4_);
        auVar107 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar86))));
        fVar87 = (float)((uint)(bVar78 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar140._0_4_);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        fVar131 = (float)((uint)bVar84 * auVar88._4_4_ | (uint)!bVar84 * auVar140._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        fVar133 = (float)((uint)bVar84 * auVar88._8_4_ | (uint)!bVar84 * auVar140._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        fVar135 = (float)((uint)bVar84 * auVar88._12_4_ | (uint)!bVar84 * auVar140._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar87))));
        auVar114._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar109._0_4_ |
                    (uint)!(bool)(bVar78 & 1) * auVar143._0_4_);
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar84 * auVar109._4_4_ | (uint)!bVar84 * auVar143._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar84 * auVar109._8_4_ | (uint)!bVar84 * auVar143._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar84 * auVar109._12_4_ | (uint)!bVar84 * auVar143._12_4_);
        fVar149 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar109._16_4_);
        auVar114._16_4_ = fVar149;
        fVar141 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar109._20_4_);
        auVar114._20_4_ = fVar141;
        fVar161 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar109._24_4_);
        auVar114._24_4_ = fVar161;
        iVar1 = (uint)(byte)(uVar76 >> 7) * auVar109._28_4_;
        auVar114._28_4_ = iVar1;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar89),auVar101);
        auVar115._0_4_ =
             (uint)(bVar78 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar90._0_4_;
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar84 * auVar100._4_4_ | (uint)!bVar84 * auVar90._4_4_;
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar84 * auVar100._8_4_ | (uint)!bVar84 * auVar90._8_4_;
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar84 * auVar100._12_4_ | (uint)!bVar84 * auVar90._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_;
        auVar115._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar182));
        auVar116._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar7._0_4_)
        ;
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar84 * auVar100._4_4_ | (uint)!bVar84 * auVar7._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar84 * auVar100._8_4_ | (uint)!bVar84 * auVar7._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar84 * auVar100._12_4_ | (uint)!bVar84 * auVar7._12_4_);
        fVar162 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
        auVar116._16_4_ = fVar162;
        fVar163 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
        auVar116._20_4_ = fVar163;
        fVar154 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
        auVar116._24_4_ = fVar154;
        auVar116._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar142),ZEXT1632(auVar6));
        auVar117._0_4_ =
             (float)((uint)(bVar78 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar88._0_4_
                    );
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar84 * auVar100._4_4_ | (uint)!bVar84 * auVar88._4_4_);
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar84 * auVar100._8_4_ | (uint)!bVar84 * auVar88._8_4_);
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar84 * auVar100._12_4_ | (uint)!bVar84 * auVar88._12_4_);
        fVar155 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
        auVar117._16_4_ = fVar155;
        fVar156 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
        auVar117._20_4_ = fVar156;
        fVar148 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
        auVar117._24_4_ = fVar148;
        iVar2 = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
        auVar117._28_4_ = iVar2;
        auVar118._0_4_ =
             (uint)(bVar78 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar101._0_4_;
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar118._4_4_ = (uint)bVar84 * (int)auVar89._4_4_ | (uint)!bVar84 * auVar101._4_4_;
        bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar118._8_4_ = (uint)bVar84 * (int)auVar89._8_4_ | (uint)!bVar84 * auVar101._8_4_;
        bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar118._12_4_ = (uint)bVar84 * (int)auVar89._12_4_ | (uint)!bVar84 * auVar101._12_4_;
        auVar118._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar101._16_4_;
        auVar118._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar101._20_4_;
        auVar118._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar101._24_4_;
        auVar118._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar101._28_4_;
        bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar76 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar104 = vsubps_avx512vl(auVar118,auVar107);
        auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar91._12_4_ |
                                                (uint)!bVar18 * auVar182._12_4_,
                                                CONCAT48((uint)bVar16 * (int)auVar91._8_4_ |
                                                         (uint)!bVar16 * auVar182._8_4_,
                                                         CONCAT44((uint)bVar84 * (int)auVar91._4_4_
                                                                  | (uint)!bVar84 * auVar182._4_4_,
                                                                  (uint)(bVar78 & 1) *
                                                                  (int)auVar91._0_4_ |
                                                                  (uint)!(bool)(bVar78 & 1) *
                                                                  auVar182._0_4_)))),auVar103);
        auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar142._12_4_ |
                                                 (uint)!bVar19 * auVar6._12_4_,
                                                 CONCAT48((uint)bVar17 * (int)auVar142._8_4_ |
                                                          (uint)!bVar17 * auVar6._8_4_,
                                                          CONCAT44((uint)bVar15 *
                                                                   (int)auVar142._4_4_ |
                                                                   (uint)!bVar15 * auVar6._4_4_,
                                                                   (uint)(bVar78 & 1) *
                                                                   (int)auVar142._0_4_ |
                                                                   (uint)!(bool)(bVar78 & 1) *
                                                                   auVar6._0_4_)))),auVar114);
        auVar108 = vsubps_avx(auVar107,auVar115);
        auVar101 = vsubps_avx(auVar103,auVar116);
        auVar102 = vsubps_avx(auVar114,auVar117);
        auVar42._4_4_ = auVar109._4_4_ * fVar130;
        auVar42._0_4_ = auVar109._0_4_ * fVar86;
        auVar42._8_4_ = auVar109._8_4_ * fVar132;
        auVar42._12_4_ = auVar109._12_4_ * fVar134;
        auVar42._16_4_ = auVar109._16_4_ * 0.0;
        auVar42._20_4_ = auVar109._20_4_ * 0.0;
        auVar42._24_4_ = auVar109._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar42,auVar114,auVar104);
        auVar152._0_4_ = fVar87 * auVar104._0_4_;
        auVar152._4_4_ = fVar131 * auVar104._4_4_;
        auVar152._8_4_ = fVar133 * auVar104._8_4_;
        auVar152._12_4_ = fVar135 * auVar104._12_4_;
        auVar152._16_4_ = auVar104._16_4_ * 0.0;
        auVar152._20_4_ = auVar104._20_4_ * 0.0;
        auVar152._24_4_ = auVar104._24_4_ * 0.0;
        auVar152._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar152,auVar107,auVar99);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar93,ZEXT1632(auVar90));
        auVar157._0_4_ = auVar99._0_4_ * auVar114._0_4_;
        auVar157._4_4_ = auVar99._4_4_ * auVar114._4_4_;
        auVar157._8_4_ = auVar99._8_4_ * auVar114._8_4_;
        auVar157._12_4_ = auVar99._12_4_ * auVar114._12_4_;
        auVar157._16_4_ = auVar99._16_4_ * fVar149;
        auVar157._20_4_ = auVar99._20_4_ * fVar141;
        auVar157._24_4_ = auVar99._24_4_ * fVar161;
        auVar157._28_4_ = 0;
        auVar90 = vfmsub231ps_fma(auVar157,auVar103,auVar109);
        auVar97 = vfmadd231ps_avx512vl(auVar100,auVar93,ZEXT1632(auVar90));
        auVar100 = vmulps_avx512vl(auVar102,auVar115);
        auVar100 = vfmsub231ps_avx512vl(auVar100,auVar108,auVar117);
        auVar43._4_4_ = auVar101._4_4_ * auVar117._4_4_;
        auVar43._0_4_ = auVar101._0_4_ * auVar117._0_4_;
        auVar43._8_4_ = auVar101._8_4_ * auVar117._8_4_;
        auVar43._12_4_ = auVar101._12_4_ * auVar117._12_4_;
        auVar43._16_4_ = auVar101._16_4_ * fVar155;
        auVar43._20_4_ = auVar101._20_4_ * fVar156;
        auVar43._24_4_ = auVar101._24_4_ * fVar148;
        auVar43._28_4_ = iVar2;
        auVar90 = vfmsub231ps_fma(auVar43,auVar116,auVar102);
        auVar158._0_4_ = auVar116._0_4_ * auVar108._0_4_;
        auVar158._4_4_ = auVar116._4_4_ * auVar108._4_4_;
        auVar158._8_4_ = auVar116._8_4_ * auVar108._8_4_;
        auVar158._12_4_ = auVar116._12_4_ * auVar108._12_4_;
        auVar158._16_4_ = fVar162 * auVar108._16_4_;
        auVar158._20_4_ = fVar163 * auVar108._20_4_;
        auVar158._24_4_ = fVar154 * auVar108._24_4_;
        auVar158._28_4_ = 0;
        auVar88 = vfmsub231ps_fma(auVar158,auVar101,auVar115);
        auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar93,auVar100);
        auVar98 = vfmadd231ps_avx512vl(auVar100,auVar93,ZEXT1632(auVar90));
        auVar100 = vmaxps_avx(auVar97,auVar98);
        uVar22 = vcmpps_avx512vl(auVar100,auVar93,2);
        local_270 = local_270 & (byte)uVar22;
        auVar186 = ZEXT3264(local_3e0);
        auVar193 = ZEXT3264(local_340);
        auVar185 = ZEXT3264(local_400);
        auVar181 = ZEXT3264(local_420);
        if (local_270 == 0) {
          local_270 = 0;
        }
        else {
          auVar44._4_4_ = auVar102._4_4_ * auVar99._4_4_;
          auVar44._0_4_ = auVar102._0_4_ * auVar99._0_4_;
          auVar44._8_4_ = auVar102._8_4_ * auVar99._8_4_;
          auVar44._12_4_ = auVar102._12_4_ * auVar99._12_4_;
          auVar44._16_4_ = auVar102._16_4_ * auVar99._16_4_;
          auVar44._20_4_ = auVar102._20_4_ * auVar99._20_4_;
          auVar44._24_4_ = auVar102._24_4_ * auVar99._24_4_;
          auVar44._28_4_ = auVar100._28_4_;
          auVar182 = vfmsub231ps_fma(auVar44,auVar101,auVar109);
          auVar45._4_4_ = auVar109._4_4_ * auVar108._4_4_;
          auVar45._0_4_ = auVar109._0_4_ * auVar108._0_4_;
          auVar45._8_4_ = auVar109._8_4_ * auVar108._8_4_;
          auVar45._12_4_ = auVar109._12_4_ * auVar108._12_4_;
          auVar45._16_4_ = auVar109._16_4_ * auVar108._16_4_;
          auVar45._20_4_ = auVar109._20_4_ * auVar108._20_4_;
          auVar45._24_4_ = auVar109._24_4_ * auVar108._24_4_;
          auVar45._28_4_ = auVar109._28_4_;
          auVar88 = vfmsub231ps_fma(auVar45,auVar104,auVar102);
          auVar46._4_4_ = auVar101._4_4_ * auVar104._4_4_;
          auVar46._0_4_ = auVar101._0_4_ * auVar104._0_4_;
          auVar46._8_4_ = auVar101._8_4_ * auVar104._8_4_;
          auVar46._12_4_ = auVar101._12_4_ * auVar104._12_4_;
          auVar46._16_4_ = auVar101._16_4_ * auVar104._16_4_;
          auVar46._20_4_ = auVar101._20_4_ * auVar104._20_4_;
          auVar46._24_4_ = auVar101._24_4_ * auVar104._24_4_;
          auVar46._28_4_ = auVar101._28_4_;
          auVar6 = vfmsub231ps_fma(auVar46,auVar108,auVar99);
          auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar6));
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar182),auVar93);
          auVar99 = vrcp14ps_avx512vl(auVar100);
          auVar24._8_4_ = 0x3f800000;
          auVar24._0_8_ = &DAT_3f8000003f800000;
          auVar24._12_4_ = 0x3f800000;
          auVar24._16_4_ = 0x3f800000;
          auVar24._20_4_ = 0x3f800000;
          auVar24._24_4_ = 0x3f800000;
          auVar24._28_4_ = 0x3f800000;
          auVar109 = vfnmadd213ps_avx512vl(auVar99,auVar100,auVar24);
          auVar90 = vfmadd132ps_fma(auVar109,auVar99,auVar99);
          auVar47._4_4_ = auVar6._4_4_ * auVar114._4_4_;
          auVar47._0_4_ = auVar6._0_4_ * auVar114._0_4_;
          auVar47._8_4_ = auVar6._8_4_ * auVar114._8_4_;
          auVar47._12_4_ = auVar6._12_4_ * auVar114._12_4_;
          auVar47._16_4_ = fVar149 * 0.0;
          auVar47._20_4_ = fVar141 * 0.0;
          auVar47._24_4_ = fVar161 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar88 = vfmadd231ps_fma(auVar47,auVar103,ZEXT1632(auVar88));
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar107,ZEXT1632(auVar182));
          fVar141 = auVar90._0_4_;
          fVar161 = auVar90._4_4_;
          fVar162 = auVar90._8_4_;
          fVar163 = auVar90._12_4_;
          auVar99 = ZEXT1632(CONCAT412(auVar88._12_4_ * fVar163,
                                       CONCAT48(auVar88._8_4_ * fVar162,
                                                CONCAT44(auVar88._4_4_ * fVar161,
                                                         auVar88._0_4_ * fVar141))));
          auVar169._4_4_ = uVar136;
          auVar169._0_4_ = uVar136;
          auVar169._8_4_ = uVar136;
          auVar169._12_4_ = uVar136;
          auVar169._16_4_ = uVar136;
          auVar169._20_4_ = uVar136;
          auVar169._24_4_ = uVar136;
          auVar169._28_4_ = uVar136;
          uVar22 = vcmpps_avx512vl(auVar169,auVar99,2);
          fVar149 = ray->tfar;
          auVar25._4_4_ = fVar149;
          auVar25._0_4_ = fVar149;
          auVar25._8_4_ = fVar149;
          auVar25._12_4_ = fVar149;
          auVar25._16_4_ = fVar149;
          auVar25._20_4_ = fVar149;
          auVar25._24_4_ = fVar149;
          auVar25._28_4_ = fVar149;
          uVar23 = vcmpps_avx512vl(auVar99,auVar25,2);
          local_270 = (byte)uVar22 & (byte)uVar23 & local_270;
          if (local_270 != 0) {
            uVar22 = vcmpps_avx512vl(auVar100,auVar93,4);
            if ((local_270 & (byte)uVar22) != 0) {
              local_270 = local_270 & (byte)uVar22;
              fVar149 = auVar97._0_4_ * fVar141;
              fVar154 = auVar97._4_4_ * fVar161;
              auVar48._4_4_ = fVar154;
              auVar48._0_4_ = fVar149;
              fVar155 = auVar97._8_4_ * fVar162;
              auVar48._8_4_ = fVar155;
              fVar156 = auVar97._12_4_ * fVar163;
              auVar48._12_4_ = fVar156;
              fVar148 = auVar97._16_4_ * 0.0;
              auVar48._16_4_ = fVar148;
              fVar86 = auVar97._20_4_ * 0.0;
              auVar48._20_4_ = fVar86;
              fVar87 = auVar97._24_4_ * 0.0;
              auVar48._24_4_ = fVar87;
              auVar48._28_4_ = auVar97._28_4_;
              fVar141 = auVar98._0_4_ * fVar141;
              fVar161 = auVar98._4_4_ * fVar161;
              auVar49._4_4_ = fVar161;
              auVar49._0_4_ = fVar141;
              fVar162 = auVar98._8_4_ * fVar162;
              auVar49._8_4_ = fVar162;
              fVar163 = auVar98._12_4_ * fVar163;
              auVar49._12_4_ = fVar163;
              fVar130 = auVar98._16_4_ * 0.0;
              auVar49._16_4_ = fVar130;
              fVar131 = auVar98._20_4_ * 0.0;
              auVar49._20_4_ = fVar131;
              fVar132 = auVar98._24_4_ * 0.0;
              auVar49._24_4_ = fVar132;
              auVar49._28_4_ = auVar98._28_4_;
              auVar167._8_4_ = 0x3f800000;
              auVar167._0_8_ = &DAT_3f8000003f800000;
              auVar167._12_4_ = 0x3f800000;
              auVar167._16_4_ = 0x3f800000;
              auVar167._20_4_ = 0x3f800000;
              auVar167._24_4_ = 0x3f800000;
              auVar167._28_4_ = 0x3f800000;
              auVar100 = vsubps_avx(auVar167,auVar48);
              local_440._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar149 | (uint)!(bool)(bVar78 & 1) * auVar100._0_4_;
              bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
              local_440._4_4_ = (uint)bVar84 * (int)fVar154 | (uint)!bVar84 * auVar100._4_4_;
              bVar84 = (bool)((byte)(uVar76 >> 2) & 1);
              local_440._8_4_ = (uint)bVar84 * (int)fVar155 | (uint)!bVar84 * auVar100._8_4_;
              bVar84 = (bool)((byte)(uVar76 >> 3) & 1);
              local_440._12_4_ = (uint)bVar84 * (int)fVar156 | (uint)!bVar84 * auVar100._12_4_;
              bVar84 = (bool)((byte)(uVar76 >> 4) & 1);
              local_440._16_4_ = (uint)bVar84 * (int)fVar148 | (uint)!bVar84 * auVar100._16_4_;
              bVar84 = (bool)((byte)(uVar76 >> 5) & 1);
              local_440._20_4_ = (uint)bVar84 * (int)fVar86 | (uint)!bVar84 * auVar100._20_4_;
              bVar84 = (bool)((byte)(uVar76 >> 6) & 1);
              local_440._24_4_ = (uint)bVar84 * (int)fVar87 | (uint)!bVar84 * auVar100._24_4_;
              bVar84 = SUB81(uVar76 >> 7,0);
              local_440._28_4_ = (uint)bVar84 * auVar97._28_4_ | (uint)!bVar84 * auVar100._28_4_;
              auVar100 = vsubps_avx(auVar167,auVar49);
              bVar84 = (bool)((byte)(uVar76 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar76 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar76 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar76 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar76 >> 6) & 1);
              bVar20 = SUB81(uVar76 >> 7,0);
              local_1a0._4_4_ = (uint)bVar84 * (int)fVar161 | (uint)!bVar84 * auVar100._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar141 | (uint)!(bool)(bVar78 & 1) * auVar100._0_4_;
              local_1a0._8_4_ = (uint)bVar15 * (int)fVar162 | (uint)!bVar15 * auVar100._8_4_;
              local_1a0._12_4_ = (uint)bVar16 * (int)fVar163 | (uint)!bVar16 * auVar100._12_4_;
              local_1a0._16_4_ = (uint)bVar17 * (int)fVar130 | (uint)!bVar17 * auVar100._16_4_;
              local_1a0._20_4_ = (uint)bVar18 * (int)fVar131 | (uint)!bVar18 * auVar100._20_4_;
              local_1a0._24_4_ = (uint)bVar19 * (int)fVar132 | (uint)!bVar19 * auVar100._24_4_;
              local_1a0._28_4_ = (uint)bVar20 * auVar98._28_4_ | (uint)!bVar20 * auVar100._28_4_;
              local_460 = auVar99;
              goto LAB_01d8677a;
            }
          }
          local_270 = 0;
        }
LAB_01d8677a:
        auVar190 = ZEXT3264(local_4e0);
        auVar189 = ZEXT3264(local_4c0);
        auVar188 = ZEXT3264(local_4a0);
        auVar187 = ZEXT3264(local_480);
        auVar192 = ZEXT3264(local_380);
        auVar191 = ZEXT3264(local_360);
        if (local_270 != 0) {
          auVar100 = vsubps_avx(auVar96,auVar95);
          auVar90 = vfmadd213ps_fma(auVar100,local_440,auVar95);
          fVar149 = pre->depth_scale;
          auVar26._4_4_ = fVar149;
          auVar26._0_4_ = fVar149;
          auVar26._8_4_ = fVar149;
          auVar26._12_4_ = fVar149;
          auVar26._16_4_ = fVar149;
          auVar26._20_4_ = fVar149;
          auVar26._24_4_ = fVar149;
          auVar26._28_4_ = fVar149;
          auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                        CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                 CONCAT44(auVar90._4_4_ +
                                                                          auVar90._4_4_,
                                                                          auVar90._0_4_ +
                                                                          auVar90._0_4_)))),auVar26)
          ;
          uVar22 = vcmpps_avx512vl(local_460,auVar100,6);
          local_270 = local_270 & (byte)uVar22;
          if (local_270 != 0) {
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar27._8_4_ = 0x40000000;
            auVar27._0_8_ = 0x4000000040000000;
            auVar27._12_4_ = 0x40000000;
            auVar27._16_4_ = 0x40000000;
            auVar27._20_4_ = 0x40000000;
            auVar27._24_4_ = 0x40000000;
            auVar27._28_4_ = 0x40000000;
            local_300 = vfmadd132ps_avx512vl(local_1a0,auVar138,auVar27);
            local_1a0 = local_300;
            auVar100 = local_1a0;
            local_2c0 = 0;
            local_2b0 = local_570._0_8_;
            uStack_2a8 = local_570._8_8_;
            local_2a0 = local_390._0_8_;
            uStack_298 = local_390._8_8_;
            local_290 = local_3a0._0_8_;
            uStack_288 = local_3a0._8_8_;
            local_280 = local_3b0._0_8_;
            uStack_278 = local_3b0._8_8_;
            if ((pGVar13->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar84 = true, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar149 = 1.0 / (float)local_600._0_4_;
                local_260[0] = fVar149 * (local_440._0_4_ + 0.0);
                local_260[1] = fVar149 * (local_440._4_4_ + 1.0);
                local_260[2] = fVar149 * (local_440._8_4_ + 2.0);
                local_260[3] = fVar149 * (local_440._12_4_ + 3.0);
                fStack_250 = fVar149 * (local_440._16_4_ + 4.0);
                fStack_24c = fVar149 * (local_440._20_4_ + 5.0);
                fStack_248 = fVar149 * (local_440._24_4_ + 6.0);
                fStack_244 = local_440._28_4_ + 7.0;
                local_1a0._0_8_ = local_300._0_8_;
                local_1a0._8_8_ = local_300._8_8_;
                local_1a0._16_8_ = local_300._16_8_;
                local_1a0._24_8_ = local_300._24_8_;
                local_240 = local_1a0._0_8_;
                uStack_238 = local_1a0._8_8_;
                uStack_230 = local_1a0._16_8_;
                uStack_228 = local_1a0._24_8_;
                local_220 = local_460;
                local_550 = local_390._0_4_;
                uStack_54c = local_390._4_4_;
                uStack_548 = local_390._8_8_;
                local_618 = 0;
                local_200 = (ulong)local_270;
                for (uVar76 = local_200; (uVar76 & 1) == 0;
                    uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                  local_618 = local_618 + 1;
                }
                local_580 = local_3a0._0_4_;
                uStack_57c = local_3a0._4_4_;
                uStack_578 = local_3a0._8_8_;
                local_560 = local_3b0._0_4_;
                fStack_55c = local_3b0._4_4_;
                fStack_558 = local_3b0._8_4_;
                fStack_554 = local_3b0._12_4_;
                bVar84 = true;
                local_630 = context;
                local_628 = pre;
                local_620 = prim;
                local_500 = uVar136;
                local_320 = local_440;
                local_2e0 = local_460;
                local_2bc = iVar12;
                local_1a0 = auVar100;
                do {
                  auVar182 = auVar183._0_16_;
                  local_5b4 = local_260[local_618];
                  local_5b0 = *(undefined4 *)((long)&local_240 + local_618 * 4);
                  local_610 = CONCAT44(local_610._4_4_,ray->tfar);
                  ray->tfar = *(float *)(local_220 + local_618 * 4);
                  local_5f0.context = context->user;
                  fVar141 = 1.0 - local_5b4;
                  fVar149 = fVar141 * fVar141 * -3.0;
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),
                                            ZEXT416((uint)(local_5b4 * fVar141)),ZEXT416(0xc0000000)
                                           );
                  auVar88 = vfmsub132ss_fma(ZEXT416((uint)(local_5b4 * fVar141)),
                                            ZEXT416((uint)(local_5b4 * local_5b4)),
                                            ZEXT416(0x40000000));
                  fVar141 = auVar90._0_4_ * 3.0;
                  fVar161 = auVar88._0_4_ * 3.0;
                  fVar162 = local_5b4 * local_5b4 * 3.0;
                  auVar164._0_4_ = fVar162 * local_560;
                  auVar164._4_4_ = fVar162 * fStack_55c;
                  auVar164._8_4_ = fVar162 * fStack_558;
                  auVar164._12_4_ = fVar162 * fStack_554;
                  auVar144._4_4_ = fVar161;
                  auVar144._0_4_ = fVar161;
                  auVar144._8_4_ = fVar161;
                  auVar144._12_4_ = fVar161;
                  auVar70._4_4_ = uStack_57c;
                  auVar70._0_4_ = local_580;
                  auVar70._8_8_ = uStack_578;
                  auVar90 = vfmadd132ps_fma(auVar144,auVar164,auVar70);
                  auVar150._4_4_ = fVar141;
                  auVar150._0_4_ = fVar141;
                  auVar150._8_4_ = fVar141;
                  auVar150._12_4_ = fVar141;
                  auVar72._4_4_ = uStack_54c;
                  auVar72._0_4_ = local_550;
                  auVar72._8_8_ = uStack_548;
                  auVar90 = vfmadd132ps_fma(auVar150,auVar90,auVar72);
                  auVar145._4_4_ = fVar149;
                  auVar145._0_4_ = fVar149;
                  auVar145._8_4_ = fVar149;
                  auVar145._12_4_ = fVar149;
                  auVar90 = vfmadd132ps_fma(auVar145,auVar90,local_570);
                  local_5c0 = vmovlps_avx(auVar90);
                  local_5b8 = vextractps_avx(auVar90,2);
                  local_5ac = (undefined4)local_588;
                  local_5a8 = (undefined4)local_608;
                  local_5a4 = (local_5f0.context)->instID[0];
                  local_5a0 = (local_5f0.context)->instPrimID[0];
                  local_634 = -1;
                  local_5f0.valid = &local_634;
                  local_5f0.geometryUserPtr = pGVar13->userPtr;
                  local_5f0.hit = (RTCHitN *)&local_5c0;
                  local_5f0.N = 1;
                  local_5f0.ray = (RTCRayN *)ray;
                  if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01d86b2e:
                    auVar90 = auVar183._0_16_;
                    p_Var14 = context->args->filter;
                    if (p_Var14 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar13->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var14)(&local_5f0);
                      auVar192 = ZEXT3264(local_380);
                      auVar191 = ZEXT3264(local_360);
                      auVar190 = ZEXT3264(local_4e0);
                      auVar189 = ZEXT3264(local_4c0);
                      auVar188 = ZEXT3264(local_4a0);
                      auVar187 = ZEXT3264(local_480);
                      auVar181 = ZEXT3264(local_420);
                      auVar185 = ZEXT3264(local_400);
                      auVar193 = ZEXT3264(local_340);
                      auVar186 = ZEXT3264(local_3e0);
                      auVar90 = vxorps_avx512vl(auVar90,auVar90);
                      auVar183 = ZEXT1664(auVar90);
                      context = local_630;
                      prim = local_620;
                      pre = local_628;
                      uVar136 = local_500;
                    }
                    if (*local_5f0.valid != 0) break;
                  }
                  else {
                    (*pGVar13->occlusionFilterN)(&local_5f0);
                    auVar192 = ZEXT3264(local_380);
                    auVar191 = ZEXT3264(local_360);
                    auVar190 = ZEXT3264(local_4e0);
                    auVar189 = ZEXT3264(local_4c0);
                    auVar188 = ZEXT3264(local_4a0);
                    auVar187 = ZEXT3264(local_480);
                    auVar181 = ZEXT3264(local_420);
                    auVar185 = ZEXT3264(local_400);
                    auVar193 = ZEXT3264(local_340);
                    auVar186 = ZEXT3264(local_3e0);
                    auVar90 = vxorps_avx512vl(auVar182,auVar182);
                    auVar183 = ZEXT1664(auVar90);
                    context = local_630;
                    prim = local_620;
                    pre = local_628;
                    uVar136 = local_500;
                    if (*local_5f0.valid != 0) goto LAB_01d86b2e;
                  }
                  ray->tfar = (float)local_610;
                  uVar76 = local_618 & 0x3f;
                  local_618 = 0;
                  local_200 = local_200 ^ 1L << uVar76;
                  for (uVar76 = local_200; (uVar76 & 1) == 0;
                      uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                    local_618 = local_618 + 1;
                  }
                  bVar84 = local_200 != 0;
                } while (bVar84);
              }
              goto LAB_01d86c67;
            }
          }
        }
        bVar84 = false;
      }
LAB_01d86c67:
      local_630 = context;
      local_620 = prim;
      local_628 = pre;
      if (8 < iVar12) {
        auVar100 = vpbroadcastd_avx512vl();
        auVar184 = ZEXT3264(auVar100);
        local_500 = local_1c0;
        uStack_4fc = local_1c0;
        uStack_4f8 = local_1c0;
        uStack_4f4 = local_1c0;
        uStack_4f0 = local_1c0;
        uStack_4ec = local_1c0;
        uStack_4e8 = local_1c0;
        uStack_4e4 = local_1c0;
        local_1c0 = uVar136;
        uStack_1bc = uVar136;
        uStack_1b8 = uVar136;
        uStack_1b4 = uVar136;
        uStack_1b0 = uVar136;
        uStack_1ac = uVar136;
        uStack_1a8 = uVar136;
        uStack_1a4 = uVar136;
        local_200._0_4_ = 1.0 / (float)local_600._0_4_;
        local_200._4_4_ = (float)local_200;
        fStack_1f8 = (float)local_200;
        fStack_1f4 = (float)local_200;
        fStack_1f0 = (float)local_200;
        fStack_1ec = (float)local_200;
        fStack_1e8 = (float)local_200;
        fStack_1e4 = (float)local_200;
        lVar81 = 8;
        do {
          auVar100 = vpbroadcastd_avx512vl();
          auVar101 = vpor_avx2(auVar100,_DAT_0205a920);
          uVar23 = vpcmpgtd_avx512vl(auVar184._0_32_,auVar101);
          auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar69);
          auVar99 = *(undefined1 (*) [32])(lVar69 + 0x2227768 + lVar81 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar69 + 0x2227bec + lVar81 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar69 + 0x2228070 + lVar81 * 4);
          local_4c0 = auVar189._0_32_;
          auVar102 = vmulps_avx512vl(local_4c0,auVar108);
          local_4e0 = auVar190._0_32_;
          auVar107 = vmulps_avx512vl(local_4e0,auVar108);
          auVar50._4_4_ = auVar108._4_4_ * (float)local_e0._4_4_;
          auVar50._0_4_ = auVar108._0_4_ * (float)local_e0._0_4_;
          auVar50._8_4_ = auVar108._8_4_ * fStack_d8;
          auVar50._12_4_ = auVar108._12_4_ * fStack_d4;
          auVar50._16_4_ = auVar108._16_4_ * fStack_d0;
          auVar50._20_4_ = auVar108._20_4_ * fStack_cc;
          auVar50._24_4_ = auVar108._24_4_ * fStack_c8;
          auVar50._28_4_ = auVar101._28_4_;
          local_480 = auVar187._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar102,auVar109,local_480);
          local_4a0 = auVar188._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar107,auVar109,local_4a0);
          auVar90 = vfmadd231ps_fma(auVar50,auVar109,local_c0);
          auVar170 = auVar185._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar170);
          auVar166 = auVar181._0_32_;
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar166);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar99,local_a0);
          auVar177 = auVar186._0_32_;
          auVar98 = vfmadd231ps_avx512vl(auVar101,auVar100,auVar177);
          local_340 = auVar193._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar102,auVar100,local_340);
          auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar69);
          auVar102 = *(undefined1 (*) [32])(lVar69 + 0x2229b88 + lVar81 * 4);
          auVar94 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar100,local_100);
          auVar107 = *(undefined1 (*) [32])(lVar69 + 0x222a00c + lVar81 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar69 + 0x222a490 + lVar81 * 4);
          auVar104 = vmulps_avx512vl(local_4c0,auVar103);
          auVar97 = vmulps_avx512vl(local_4e0,auVar103);
          auVar51._4_4_ = auVar103._4_4_ * (float)local_e0._4_4_;
          auVar51._0_4_ = auVar103._0_4_ * (float)local_e0._0_4_;
          auVar51._8_4_ = auVar103._8_4_ * fStack_d8;
          auVar51._12_4_ = auVar103._12_4_ * fStack_d4;
          auVar51._16_4_ = auVar103._16_4_ * fStack_d0;
          auVar51._20_4_ = auVar103._20_4_ * fStack_cc;
          auVar51._24_4_ = auVar103._24_4_ * fStack_c8;
          auVar51._28_4_ = uStack_c4;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_480);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar107,local_4a0);
          auVar90 = vfmadd231ps_fma(auVar51,auVar107,local_c0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar170);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar166);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar102,local_a0);
          auVar95 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar177);
          auVar96 = vfmadd231ps_avx512vl(auVar97,auVar101,local_340);
          auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar101,local_100);
          auVar106 = vmaxps_avx512vl(auVar94,auVar105);
          auVar104 = vsubps_avx(auVar95,auVar98);
          auVar97 = vsubps_avx(auVar96,auVar93);
          auVar119 = vmulps_avx512vl(auVar93,auVar104);
          auVar120 = vmulps_avx512vl(auVar98,auVar97);
          auVar119 = vsubps_avx512vl(auVar119,auVar120);
          auVar120 = vmulps_avx512vl(auVar97,auVar97);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar104,auVar104);
          auVar106 = vmulps_avx512vl(auVar106,auVar106);
          auVar106 = vmulps_avx512vl(auVar106,auVar120);
          auVar119 = vmulps_avx512vl(auVar119,auVar119);
          uVar22 = vcmpps_avx512vl(auVar119,auVar106,2);
          local_270 = (byte)uVar23 & (byte)uVar22;
          if (local_270 == 0) {
            auVar181 = ZEXT3264(auVar166);
          }
          else {
            auVar103 = vmulps_avx512vl(local_140,auVar103);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar103);
            local_380 = auVar192._0_32_;
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_380,auVar107);
            local_360 = auVar191._0_32_;
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_360,auVar102);
            auVar108 = vmulps_avx512vl(local_140,auVar108);
            auVar109 = vfmadd213ps_avx512vl(auVar109,local_120,auVar108);
            auVar99 = vfmadd213ps_avx512vl(auVar99,local_380,auVar109);
            auVar102 = vfmadd213ps_avx512vl(auVar100,local_360,auVar99);
            auVar100 = *(undefined1 (*) [32])(lVar69 + 0x22284f4 + lVar81 * 4);
            auVar99 = *(undefined1 (*) [32])(lVar69 + 0x2228978 + lVar81 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar69 + 0x2228dfc + lVar81 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar69 + 0x2229280 + lVar81 * 4);
            auVar107 = vmulps_avx512vl(local_4c0,auVar108);
            auVar103 = vmulps_avx512vl(local_4e0,auVar108);
            auVar108 = vmulps_avx512vl(local_140,auVar108);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,local_480);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_4a0);
            auVar109 = vfmadd231ps_avx512vl(auVar108,local_120,auVar109);
            auVar108 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar170);
            auVar107 = vfmadd231ps_avx512vl(auVar103,auVar99,auVar166);
            auVar99 = vfmadd231ps_avx512vl(auVar109,local_380,auVar99);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar100,auVar177);
            auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,local_340);
            auVar103 = vfmadd231ps_avx512vl(auVar99,local_360,auVar100);
            auVar100 = *(undefined1 (*) [32])(lVar69 + 0x222a914 + lVar81 * 4);
            auVar99 = *(undefined1 (*) [32])(lVar69 + 0x222b21c + lVar81 * 4);
            auVar109 = *(undefined1 (*) [32])(lVar69 + 0x222b6a0 + lVar81 * 4);
            auVar106 = vmulps_avx512vl(local_4c0,auVar109);
            auVar119 = vmulps_avx512vl(local_4e0,auVar109);
            auVar109 = vmulps_avx512vl(local_140,auVar109);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,local_480);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar99,local_4a0);
            auVar109 = vfmadd231ps_avx512vl(auVar109,local_120,auVar99);
            auVar99 = *(undefined1 (*) [32])(lVar69 + 0x222ad98 + lVar81 * 4);
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,auVar170);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar99,auVar166);
            auVar99 = vfmadd231ps_avx512vl(auVar109,local_380,auVar99);
            auVar109 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar177);
            auVar106 = vfmadd231ps_avx512vl(auVar119,auVar100,local_340);
            auVar99 = vfmadd231ps_avx512vl(auVar99,local_360,auVar100);
            auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar108,auVar119);
            vandps_avx512vl(auVar107,auVar119);
            auVar100 = vmaxps_avx(auVar119,auVar119);
            vandps_avx512vl(auVar103,auVar119);
            auVar100 = vmaxps_avx(auVar100,auVar119);
            auVar73._4_4_ = uStack_4fc;
            auVar73._0_4_ = local_500;
            auVar73._8_4_ = uStack_4f8;
            auVar73._12_4_ = uStack_4f4;
            auVar73._16_4_ = uStack_4f0;
            auVar73._20_4_ = uStack_4ec;
            auVar73._24_4_ = uStack_4e8;
            auVar73._28_4_ = uStack_4e4;
            uVar76 = vcmpps_avx512vl(auVar100,auVar73,1);
            bVar15 = (bool)((byte)uVar76 & 1);
            auVar121._0_4_ = (float)((uint)bVar15 * auVar104._0_4_ | (uint)!bVar15 * auVar108._0_4_)
            ;
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar108._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar108._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar108._12_4_);
            bVar15 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar121._16_4_ =
                 (float)((uint)bVar15 * auVar104._16_4_ | (uint)!bVar15 * auVar108._16_4_);
            bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar121._20_4_ =
                 (float)((uint)bVar15 * auVar104._20_4_ | (uint)!bVar15 * auVar108._20_4_);
            bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar121._24_4_ =
                 (float)((uint)bVar15 * auVar104._24_4_ | (uint)!bVar15 * auVar108._24_4_);
            bVar15 = SUB81(uVar76 >> 7,0);
            auVar121._28_4_ = (uint)bVar15 * auVar104._28_4_ | (uint)!bVar15 * auVar108._28_4_;
            bVar15 = (bool)((byte)uVar76 & 1);
            auVar122._0_4_ = (float)((uint)bVar15 * auVar97._0_4_ | (uint)!bVar15 * auVar107._0_4_);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar107._4_4_);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar107._8_4_);
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar107._12_4_);
            bVar15 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar122._16_4_ =
                 (float)((uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * auVar107._16_4_);
            bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar122._20_4_ =
                 (float)((uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * auVar107._20_4_);
            bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar122._24_4_ =
                 (float)((uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * auVar107._24_4_);
            bVar15 = SUB81(uVar76 >> 7,0);
            auVar122._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar107._28_4_;
            vandps_avx512vl(auVar109,auVar119);
            vandps_avx512vl(auVar106,auVar119);
            auVar100 = vmaxps_avx(auVar122,auVar122);
            vandps_avx512vl(auVar99,auVar119);
            auVar100 = vmaxps_avx(auVar100,auVar122);
            uVar76 = vcmpps_avx512vl(auVar100,auVar73,1);
            bVar15 = (bool)((byte)uVar76 & 1);
            auVar123._0_4_ = (uint)bVar15 * auVar104._0_4_ | (uint)!bVar15 * auVar109._0_4_;
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar123._4_4_ = (uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar109._4_4_;
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar123._8_4_ = (uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar109._8_4_;
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar123._12_4_ = (uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar109._12_4_;
            bVar15 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar123._16_4_ = (uint)bVar15 * auVar104._16_4_ | (uint)!bVar15 * auVar109._16_4_;
            bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar123._20_4_ = (uint)bVar15 * auVar104._20_4_ | (uint)!bVar15 * auVar109._20_4_;
            bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar123._24_4_ = (uint)bVar15 * auVar104._24_4_ | (uint)!bVar15 * auVar109._24_4_;
            bVar15 = SUB81(uVar76 >> 7,0);
            auVar123._28_4_ = (uint)bVar15 * auVar104._28_4_ | (uint)!bVar15 * auVar109._28_4_;
            bVar15 = (bool)((byte)uVar76 & 1);
            auVar124._0_4_ = (float)((uint)bVar15 * auVar97._0_4_ | (uint)!bVar15 * auVar106._0_4_);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar106._4_4_);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar106._8_4_);
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar106._12_4_);
            bVar15 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar124._16_4_ =
                 (float)((uint)bVar15 * auVar97._16_4_ | (uint)!bVar15 * auVar106._16_4_);
            bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar124._20_4_ =
                 (float)((uint)bVar15 * auVar97._20_4_ | (uint)!bVar15 * auVar106._20_4_);
            bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar124._24_4_ =
                 (float)((uint)bVar15 * auVar97._24_4_ | (uint)!bVar15 * auVar106._24_4_);
            bVar15 = SUB81(uVar76 >> 7,0);
            auVar124._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar106._28_4_;
            auVar173._8_4_ = 0x80000000;
            auVar173._0_8_ = 0x8000000080000000;
            auVar173._12_4_ = 0x80000000;
            auVar173._16_4_ = 0x80000000;
            auVar173._20_4_ = 0x80000000;
            auVar173._24_4_ = 0x80000000;
            auVar173._28_4_ = 0x80000000;
            auVar100 = vxorps_avx512vl(auVar123,auVar173);
            auVar106 = auVar183._0_32_;
            auVar99 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar106);
            auVar90 = vfmadd231ps_fma(auVar99,auVar122,auVar122);
            auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar90));
            auVar180._8_4_ = 0xbf000000;
            auVar180._0_8_ = 0xbf000000bf000000;
            auVar180._12_4_ = 0xbf000000;
            auVar180._16_4_ = 0xbf000000;
            auVar180._20_4_ = 0xbf000000;
            auVar180._24_4_ = 0xbf000000;
            auVar180._28_4_ = 0xbf000000;
            fVar149 = auVar99._0_4_;
            fVar141 = auVar99._4_4_;
            fVar161 = auVar99._8_4_;
            fVar162 = auVar99._12_4_;
            fVar163 = auVar99._16_4_;
            fVar154 = auVar99._20_4_;
            fVar155 = auVar99._24_4_;
            auVar52._4_4_ = fVar141 * fVar141 * fVar141 * auVar90._4_4_ * -0.5;
            auVar52._0_4_ = fVar149 * fVar149 * fVar149 * auVar90._0_4_ * -0.5;
            auVar52._8_4_ = fVar161 * fVar161 * fVar161 * auVar90._8_4_ * -0.5;
            auVar52._12_4_ = fVar162 * fVar162 * fVar162 * auVar90._12_4_ * -0.5;
            auVar52._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
            auVar52._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
            auVar52._24_4_ = fVar155 * fVar155 * fVar155 * -0.0;
            auVar52._28_4_ = auVar122._28_4_;
            auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar99 = vfmadd231ps_avx512vl(auVar52,auVar109,auVar99);
            auVar53._4_4_ = auVar122._4_4_ * auVar99._4_4_;
            auVar53._0_4_ = auVar122._0_4_ * auVar99._0_4_;
            auVar53._8_4_ = auVar122._8_4_ * auVar99._8_4_;
            auVar53._12_4_ = auVar122._12_4_ * auVar99._12_4_;
            auVar53._16_4_ = auVar122._16_4_ * auVar99._16_4_;
            auVar53._20_4_ = auVar122._20_4_ * auVar99._20_4_;
            auVar53._24_4_ = auVar122._24_4_ * auVar99._24_4_;
            auVar53._28_4_ = 0;
            auVar54._4_4_ = auVar99._4_4_ * -auVar121._4_4_;
            auVar54._0_4_ = auVar99._0_4_ * -auVar121._0_4_;
            auVar54._8_4_ = auVar99._8_4_ * -auVar121._8_4_;
            auVar54._12_4_ = auVar99._12_4_ * -auVar121._12_4_;
            auVar54._16_4_ = auVar99._16_4_ * -auVar121._16_4_;
            auVar54._20_4_ = auVar99._20_4_ * -auVar121._20_4_;
            auVar54._24_4_ = auVar99._24_4_ * -auVar121._24_4_;
            auVar54._28_4_ = auVar122._28_4_;
            auVar108 = vmulps_avx512vl(auVar99,auVar106);
            auVar99 = vfmadd213ps_avx512vl(auVar123,auVar123,auVar106);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar124,auVar124);
            auVar107 = vrsqrt14ps_avx512vl(auVar99);
            auVar99 = vmulps_avx512vl(auVar99,auVar180);
            fVar149 = auVar107._0_4_;
            fVar141 = auVar107._4_4_;
            fVar161 = auVar107._8_4_;
            fVar162 = auVar107._12_4_;
            fVar163 = auVar107._16_4_;
            fVar154 = auVar107._20_4_;
            fVar155 = auVar107._24_4_;
            auVar55._4_4_ = fVar141 * fVar141 * fVar141 * auVar99._4_4_;
            auVar55._0_4_ = fVar149 * fVar149 * fVar149 * auVar99._0_4_;
            auVar55._8_4_ = fVar161 * fVar161 * fVar161 * auVar99._8_4_;
            auVar55._12_4_ = fVar162 * fVar162 * fVar162 * auVar99._12_4_;
            auVar55._16_4_ = fVar163 * fVar163 * fVar163 * auVar99._16_4_;
            auVar55._20_4_ = fVar154 * fVar154 * fVar154 * auVar99._20_4_;
            auVar55._24_4_ = fVar155 * fVar155 * fVar155 * auVar99._24_4_;
            auVar55._28_4_ = auVar99._28_4_;
            auVar99 = vfmadd231ps_avx512vl(auVar55,auVar109,auVar107);
            auVar56._4_4_ = auVar124._4_4_ * auVar99._4_4_;
            auVar56._0_4_ = auVar124._0_4_ * auVar99._0_4_;
            auVar56._8_4_ = auVar124._8_4_ * auVar99._8_4_;
            auVar56._12_4_ = auVar124._12_4_ * auVar99._12_4_;
            auVar56._16_4_ = auVar124._16_4_ * auVar99._16_4_;
            auVar56._20_4_ = auVar124._20_4_ * auVar99._20_4_;
            auVar56._24_4_ = auVar124._24_4_ * auVar99._24_4_;
            auVar56._28_4_ = auVar107._28_4_;
            auVar57._4_4_ = auVar99._4_4_ * auVar100._4_4_;
            auVar57._0_4_ = auVar99._0_4_ * auVar100._0_4_;
            auVar57._8_4_ = auVar99._8_4_ * auVar100._8_4_;
            auVar57._12_4_ = auVar99._12_4_ * auVar100._12_4_;
            auVar57._16_4_ = auVar99._16_4_ * auVar100._16_4_;
            auVar57._20_4_ = auVar99._20_4_ * auVar100._20_4_;
            auVar57._24_4_ = auVar99._24_4_ * auVar100._24_4_;
            auVar57._28_4_ = auVar100._28_4_;
            auVar100 = vmulps_avx512vl(auVar99,auVar106);
            auVar90 = vfmadd213ps_fma(auVar53,auVar94,auVar98);
            auVar88 = vfmadd213ps_fma(auVar54,auVar94,auVar93);
            auVar109 = vfmadd213ps_avx512vl(auVar108,auVar94,auVar102);
            auVar107 = vfmadd213ps_avx512vl(auVar56,auVar105,auVar95);
            auVar10 = vfnmadd213ps_fma(auVar53,auVar94,auVar98);
            auVar182 = vfmadd213ps_fma(auVar57,auVar105,auVar96);
            auVar89 = vfnmadd213ps_fma(auVar54,auVar94,auVar93);
            auVar6 = vfmadd213ps_fma(auVar100,auVar105,auVar101);
            auVar142 = vfnmadd231ps_fma(auVar102,auVar94,auVar108);
            auVar91 = vfnmadd213ps_fma(auVar56,auVar105,auVar95);
            auVar140 = vfnmadd213ps_fma(auVar57,auVar105,auVar96);
            auVar143 = vfnmadd231ps_fma(auVar101,auVar105,auVar100);
            auVar101 = vsubps_avx512vl(auVar107,ZEXT1632(auVar10));
            auVar100 = vsubps_avx(ZEXT1632(auVar182),ZEXT1632(auVar89));
            auVar99 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar142));
            auVar58._4_4_ = auVar100._4_4_ * auVar142._4_4_;
            auVar58._0_4_ = auVar100._0_4_ * auVar142._0_4_;
            auVar58._8_4_ = auVar100._8_4_ * auVar142._8_4_;
            auVar58._12_4_ = auVar100._12_4_ * auVar142._12_4_;
            auVar58._16_4_ = auVar100._16_4_ * 0.0;
            auVar58._20_4_ = auVar100._20_4_ * 0.0;
            auVar58._24_4_ = auVar100._24_4_ * 0.0;
            auVar58._28_4_ = auVar108._28_4_;
            auVar7 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar89),auVar99);
            auVar59._4_4_ = auVar99._4_4_ * auVar10._4_4_;
            auVar59._0_4_ = auVar99._0_4_ * auVar10._0_4_;
            auVar59._8_4_ = auVar99._8_4_ * auVar10._8_4_;
            auVar59._12_4_ = auVar99._12_4_ * auVar10._12_4_;
            auVar59._16_4_ = auVar99._16_4_ * 0.0;
            auVar59._20_4_ = auVar99._20_4_ * 0.0;
            auVar59._24_4_ = auVar99._24_4_ * 0.0;
            auVar59._28_4_ = auVar99._28_4_;
            auVar8 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar142),auVar101);
            auVar60._4_4_ = auVar89._4_4_ * auVar101._4_4_;
            auVar60._0_4_ = auVar89._0_4_ * auVar101._0_4_;
            auVar60._8_4_ = auVar89._8_4_ * auVar101._8_4_;
            auVar60._12_4_ = auVar89._12_4_ * auVar101._12_4_;
            auVar60._16_4_ = auVar101._16_4_ * 0.0;
            auVar60._20_4_ = auVar101._20_4_ * 0.0;
            auVar60._24_4_ = auVar101._24_4_ * 0.0;
            auVar60._28_4_ = auVar101._28_4_;
            auVar9 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar10),auVar100);
            auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar9),auVar106,ZEXT1632(auVar8));
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar7));
            uVar76 = vcmpps_avx512vl(auVar100,auVar106,2);
            bVar78 = (byte)uVar76;
            fVar86 = (float)((uint)(bVar78 & 1) * auVar90._0_4_ |
                            (uint)!(bool)(bVar78 & 1) * auVar91._0_4_);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar130 = (float)((uint)bVar15 * auVar90._4_4_ | (uint)!bVar15 * auVar91._4_4_);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar132 = (float)((uint)bVar15 * auVar90._8_4_ | (uint)!bVar15 * auVar91._8_4_);
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar134 = (float)((uint)bVar15 * auVar90._12_4_ | (uint)!bVar15 * auVar91._12_4_);
            auVar103 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar86))));
            fVar87 = (float)((uint)(bVar78 & 1) * auVar88._0_4_ |
                            (uint)!(bool)(bVar78 & 1) * auVar140._0_4_);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            fVar131 = (float)((uint)bVar15 * auVar88._4_4_ | (uint)!bVar15 * auVar140._4_4_);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            fVar133 = (float)((uint)bVar15 * auVar88._8_4_ | (uint)!bVar15 * auVar140._8_4_);
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            fVar135 = (float)((uint)bVar15 * auVar88._12_4_ | (uint)!bVar15 * auVar140._12_4_);
            auVar104 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar87))));
            auVar125._0_4_ =
                 (float)((uint)(bVar78 & 1) * auVar109._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar143._0_4_);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar125._4_4_ = (float)((uint)bVar15 * auVar109._4_4_ | (uint)!bVar15 * auVar143._4_4_)
            ;
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar125._8_4_ = (float)((uint)bVar15 * auVar109._8_4_ | (uint)!bVar15 * auVar143._8_4_)
            ;
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar125._12_4_ =
                 (float)((uint)bVar15 * auVar109._12_4_ | (uint)!bVar15 * auVar143._12_4_);
            fVar161 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar109._16_4_);
            auVar125._16_4_ = fVar161;
            fVar141 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar109._20_4_);
            auVar125._20_4_ = fVar141;
            fVar149 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar109._24_4_);
            auVar125._24_4_ = fVar149;
            iVar1 = (uint)(byte)(uVar76 >> 7) * auVar109._28_4_;
            auVar125._28_4_ = iVar1;
            auVar100 = vblendmps_avx512vl(ZEXT1632(auVar10),auVar107);
            auVar126._0_4_ =
                 (uint)(bVar78 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar7._0_4_;
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar126._4_4_ = (uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar7._4_4_;
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar126._8_4_ = (uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar7._8_4_;
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar126._12_4_ = (uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar7._12_4_;
            auVar126._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_;
            auVar126._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_;
            auVar126._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_;
            auVar126._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
            auVar100 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar182));
            auVar127._0_4_ =
                 (float)((uint)(bVar78 & 1) * auVar100._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar90._0_4_);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar127._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar90._4_4_);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar127._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar90._8_4_);
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar127._12_4_ =
                 (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar90._12_4_);
            fVar154 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
            auVar127._16_4_ = fVar154;
            fVar163 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
            auVar127._20_4_ = fVar163;
            fVar162 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
            auVar127._24_4_ = fVar162;
            auVar127._28_4_ = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
            auVar100 = vblendmps_avx512vl(ZEXT1632(auVar142),ZEXT1632(auVar6));
            auVar128._0_4_ =
                 (float)((uint)(bVar78 & 1) * auVar100._0_4_ |
                        (uint)!(bool)(bVar78 & 1) * auVar88._0_4_);
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar88._4_4_);
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar88._8_4_);
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar88._12_4_);
            fVar156 = (float)((uint)((byte)(uVar76 >> 4) & 1) * auVar100._16_4_);
            auVar128._16_4_ = fVar156;
            fVar148 = (float)((uint)((byte)(uVar76 >> 5) & 1) * auVar100._20_4_);
            auVar128._20_4_ = fVar148;
            fVar155 = (float)((uint)((byte)(uVar76 >> 6) & 1) * auVar100._24_4_);
            auVar128._24_4_ = fVar155;
            iVar2 = (uint)(byte)(uVar76 >> 7) * auVar100._28_4_;
            auVar128._28_4_ = iVar2;
            auVar129._0_4_ =
                 (uint)(bVar78 & 1) * (int)auVar10._0_4_ |
                 (uint)!(bool)(bVar78 & 1) * auVar107._0_4_;
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar129._4_4_ = (uint)bVar15 * (int)auVar10._4_4_ | (uint)!bVar15 * auVar107._4_4_;
            bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar129._8_4_ = (uint)bVar15 * (int)auVar10._8_4_ | (uint)!bVar15 * auVar107._8_4_;
            bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar129._12_4_ = (uint)bVar15 * (int)auVar10._12_4_ | (uint)!bVar15 * auVar107._12_4_;
            auVar129._16_4_ = (uint)!(bool)((byte)(uVar76 >> 4) & 1) * auVar107._16_4_;
            auVar129._20_4_ = (uint)!(bool)((byte)(uVar76 >> 5) & 1) * auVar107._20_4_;
            auVar129._24_4_ = (uint)!(bool)((byte)(uVar76 >> 6) & 1) * auVar107._24_4_;
            auVar129._28_4_ = (uint)!SUB81(uVar76 >> 7,0) * auVar107._28_4_;
            bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar76 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar76 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar76 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar107 = vsubps_avx512vl(auVar129,auVar103);
            auVar99 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar89._12_4_ |
                                                    (uint)!bVar19 * auVar182._12_4_,
                                                    CONCAT48((uint)bVar17 * (int)auVar89._8_4_ |
                                                             (uint)!bVar17 * auVar182._8_4_,
                                                             CONCAT44((uint)bVar15 *
                                                                      (int)auVar89._4_4_ |
                                                                      (uint)!bVar15 * auVar182._4_4_
                                                                      ,(uint)(bVar78 & 1) *
                                                                       (int)auVar89._0_4_ |
                                                                       (uint)!(bool)(bVar78 & 1) *
                                                                       auVar182._0_4_)))),auVar104);
            auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar142._12_4_ |
                                                     (uint)!bVar20 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar142._8_4_ |
                                                              (uint)!bVar18 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar142._4_4_ |
                                                                       (uint)!bVar16 * auVar6._4_4_,
                                                                       (uint)(bVar78 & 1) *
                                                                       (int)auVar142._0_4_ |
                                                                       (uint)!(bool)(bVar78 & 1) *
                                                                       auVar6._0_4_)))),auVar125);
            auVar108 = vsubps_avx(auVar103,auVar126);
            auVar101 = vsubps_avx(auVar104,auVar127);
            auVar102 = vsubps_avx(auVar125,auVar128);
            auVar61._4_4_ = auVar109._4_4_ * fVar130;
            auVar61._0_4_ = auVar109._0_4_ * fVar86;
            auVar61._8_4_ = auVar109._8_4_ * fVar132;
            auVar61._12_4_ = auVar109._12_4_ * fVar134;
            auVar61._16_4_ = auVar109._16_4_ * 0.0;
            auVar61._20_4_ = auVar109._20_4_ * 0.0;
            auVar61._24_4_ = auVar109._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar61,auVar125,auVar107);
            auVar153._0_4_ = fVar87 * auVar107._0_4_;
            auVar153._4_4_ = fVar131 * auVar107._4_4_;
            auVar153._8_4_ = fVar133 * auVar107._8_4_;
            auVar153._12_4_ = fVar135 * auVar107._12_4_;
            auVar153._16_4_ = auVar107._16_4_ * 0.0;
            auVar153._20_4_ = auVar107._20_4_ * 0.0;
            auVar153._24_4_ = auVar107._24_4_ * 0.0;
            auVar153._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar153,auVar103,auVar99);
            auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar106,ZEXT1632(auVar90));
            auVar159._0_4_ = auVar99._0_4_ * auVar125._0_4_;
            auVar159._4_4_ = auVar99._4_4_ * auVar125._4_4_;
            auVar159._8_4_ = auVar99._8_4_ * auVar125._8_4_;
            auVar159._12_4_ = auVar99._12_4_ * auVar125._12_4_;
            auVar159._16_4_ = auVar99._16_4_ * fVar161;
            auVar159._20_4_ = auVar99._20_4_ * fVar141;
            auVar159._24_4_ = auVar99._24_4_ * fVar149;
            auVar159._28_4_ = 0;
            auVar90 = vfmsub231ps_fma(auVar159,auVar104,auVar109);
            auVar97 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar90));
            auVar100 = vmulps_avx512vl(auVar102,auVar126);
            auVar100 = vfmsub231ps_avx512vl(auVar100,auVar108,auVar128);
            auVar62._4_4_ = auVar101._4_4_ * auVar128._4_4_;
            auVar62._0_4_ = auVar101._0_4_ * auVar128._0_4_;
            auVar62._8_4_ = auVar101._8_4_ * auVar128._8_4_;
            auVar62._12_4_ = auVar101._12_4_ * auVar128._12_4_;
            auVar62._16_4_ = auVar101._16_4_ * fVar156;
            auVar62._20_4_ = auVar101._20_4_ * fVar148;
            auVar62._24_4_ = auVar101._24_4_ * fVar155;
            auVar62._28_4_ = iVar2;
            auVar90 = vfmsub231ps_fma(auVar62,auVar127,auVar102);
            auVar160._0_4_ = auVar127._0_4_ * auVar108._0_4_;
            auVar160._4_4_ = auVar127._4_4_ * auVar108._4_4_;
            auVar160._8_4_ = auVar127._8_4_ * auVar108._8_4_;
            auVar160._12_4_ = auVar127._12_4_ * auVar108._12_4_;
            auVar160._16_4_ = fVar154 * auVar108._16_4_;
            auVar160._20_4_ = fVar163 * auVar108._20_4_;
            auVar160._24_4_ = fVar162 * auVar108._24_4_;
            auVar160._28_4_ = 0;
            auVar88 = vfmsub231ps_fma(auVar160,auVar101,auVar126);
            auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar106,auVar100);
            auVar98 = vfmadd231ps_avx512vl(auVar100,auVar106,ZEXT1632(auVar90));
            auVar100 = vmaxps_avx(auVar97,auVar98);
            uVar22 = vcmpps_avx512vl(auVar100,auVar106,2);
            local_270 = local_270 & (byte)uVar22;
            auVar181 = ZEXT3264(auVar166);
            if (local_270 == 0) {
LAB_01d87789:
              local_270 = 0;
            }
            else {
              auVar63._4_4_ = auVar102._4_4_ * auVar99._4_4_;
              auVar63._0_4_ = auVar102._0_4_ * auVar99._0_4_;
              auVar63._8_4_ = auVar102._8_4_ * auVar99._8_4_;
              auVar63._12_4_ = auVar102._12_4_ * auVar99._12_4_;
              auVar63._16_4_ = auVar102._16_4_ * auVar99._16_4_;
              auVar63._20_4_ = auVar102._20_4_ * auVar99._20_4_;
              auVar63._24_4_ = auVar102._24_4_ * auVar99._24_4_;
              auVar63._28_4_ = auVar100._28_4_;
              auVar182 = vfmsub231ps_fma(auVar63,auVar101,auVar109);
              auVar64._4_4_ = auVar109._4_4_ * auVar108._4_4_;
              auVar64._0_4_ = auVar109._0_4_ * auVar108._0_4_;
              auVar64._8_4_ = auVar109._8_4_ * auVar108._8_4_;
              auVar64._12_4_ = auVar109._12_4_ * auVar108._12_4_;
              auVar64._16_4_ = auVar109._16_4_ * auVar108._16_4_;
              auVar64._20_4_ = auVar109._20_4_ * auVar108._20_4_;
              auVar64._24_4_ = auVar109._24_4_ * auVar108._24_4_;
              auVar64._28_4_ = auVar109._28_4_;
              auVar88 = vfmsub231ps_fma(auVar64,auVar107,auVar102);
              auVar65._4_4_ = auVar101._4_4_ * auVar107._4_4_;
              auVar65._0_4_ = auVar101._0_4_ * auVar107._0_4_;
              auVar65._8_4_ = auVar101._8_4_ * auVar107._8_4_;
              auVar65._12_4_ = auVar101._12_4_ * auVar107._12_4_;
              auVar65._16_4_ = auVar101._16_4_ * auVar107._16_4_;
              auVar65._20_4_ = auVar101._20_4_ * auVar107._20_4_;
              auVar65._24_4_ = auVar101._24_4_ * auVar107._24_4_;
              auVar65._28_4_ = auVar101._28_4_;
              auVar6 = vfmsub231ps_fma(auVar65,auVar108,auVar99);
              auVar90 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar88),ZEXT1632(auVar6));
              auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar182),auVar106);
              auVar99 = vrcp14ps_avx512vl(auVar100);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = &DAT_3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar29._16_4_ = 0x3f800000;
              auVar29._20_4_ = 0x3f800000;
              auVar29._24_4_ = 0x3f800000;
              auVar29._28_4_ = 0x3f800000;
              auVar109 = vfnmadd213ps_avx512vl(auVar99,auVar100,auVar29);
              auVar90 = vfmadd132ps_fma(auVar109,auVar99,auVar99);
              auVar66._4_4_ = auVar6._4_4_ * auVar125._4_4_;
              auVar66._0_4_ = auVar6._0_4_ * auVar125._0_4_;
              auVar66._8_4_ = auVar6._8_4_ * auVar125._8_4_;
              auVar66._12_4_ = auVar6._12_4_ * auVar125._12_4_;
              auVar66._16_4_ = fVar161 * 0.0;
              auVar66._20_4_ = fVar141 * 0.0;
              auVar66._24_4_ = fVar149 * 0.0;
              auVar66._28_4_ = iVar1;
              auVar88 = vfmadd231ps_fma(auVar66,auVar104,ZEXT1632(auVar88));
              auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar103,ZEXT1632(auVar182));
              fVar141 = auVar90._0_4_;
              fVar161 = auVar90._4_4_;
              fVar162 = auVar90._8_4_;
              fVar163 = auVar90._12_4_;
              auVar99 = ZEXT1632(CONCAT412(auVar88._12_4_ * fVar163,
                                           CONCAT48(auVar88._8_4_ * fVar162,
                                                    CONCAT44(auVar88._4_4_ * fVar161,
                                                             auVar88._0_4_ * fVar141))));
              auVar74._4_4_ = uStack_1bc;
              auVar74._0_4_ = local_1c0;
              auVar74._8_4_ = uStack_1b8;
              auVar74._12_4_ = uStack_1b4;
              auVar74._16_4_ = uStack_1b0;
              auVar74._20_4_ = uStack_1ac;
              auVar74._24_4_ = uStack_1a8;
              auVar74._28_4_ = uStack_1a4;
              uVar22 = vcmpps_avx512vl(auVar99,auVar74,0xd);
              fVar149 = ray->tfar;
              auVar30._4_4_ = fVar149;
              auVar30._0_4_ = fVar149;
              auVar30._8_4_ = fVar149;
              auVar30._12_4_ = fVar149;
              auVar30._16_4_ = fVar149;
              auVar30._20_4_ = fVar149;
              auVar30._24_4_ = fVar149;
              auVar30._28_4_ = fVar149;
              uVar23 = vcmpps_avx512vl(auVar99,auVar30,2);
              local_270 = (byte)uVar22 & (byte)uVar23 & local_270;
              if (local_270 == 0) goto LAB_01d87789;
              uVar22 = vcmpps_avx512vl(auVar100,auVar106,4);
              if ((local_270 & (byte)uVar22) == 0) goto LAB_01d87789;
              local_270 = local_270 & (byte)uVar22;
              fVar149 = auVar97._0_4_ * fVar141;
              fVar154 = auVar97._4_4_ * fVar161;
              auVar67._4_4_ = fVar154;
              auVar67._0_4_ = fVar149;
              fVar155 = auVar97._8_4_ * fVar162;
              auVar67._8_4_ = fVar155;
              fVar156 = auVar97._12_4_ * fVar163;
              auVar67._12_4_ = fVar156;
              fVar148 = auVar97._16_4_ * 0.0;
              auVar67._16_4_ = fVar148;
              fVar86 = auVar97._20_4_ * 0.0;
              auVar67._20_4_ = fVar86;
              fVar87 = auVar97._24_4_ * 0.0;
              auVar67._24_4_ = fVar87;
              auVar67._28_4_ = auVar97._28_4_;
              fVar141 = auVar98._0_4_ * fVar141;
              fVar161 = auVar98._4_4_ * fVar161;
              auVar68._4_4_ = fVar161;
              auVar68._0_4_ = fVar141;
              fVar162 = auVar98._8_4_ * fVar162;
              auVar68._8_4_ = fVar162;
              fVar163 = auVar98._12_4_ * fVar163;
              auVar68._12_4_ = fVar163;
              fVar130 = auVar98._16_4_ * 0.0;
              auVar68._16_4_ = fVar130;
              fVar131 = auVar98._20_4_ * 0.0;
              auVar68._20_4_ = fVar131;
              fVar132 = auVar98._24_4_ * 0.0;
              auVar68._24_4_ = fVar132;
              auVar68._28_4_ = auVar98._28_4_;
              auVar168._8_4_ = 0x3f800000;
              auVar168._0_8_ = &DAT_3f8000003f800000;
              auVar168._12_4_ = 0x3f800000;
              auVar168._16_4_ = 0x3f800000;
              auVar168._20_4_ = 0x3f800000;
              auVar168._24_4_ = 0x3f800000;
              auVar168._28_4_ = 0x3f800000;
              auVar100 = vsubps_avx(auVar168,auVar67);
              local_520._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar149 | (uint)!(bool)(bVar78 & 1) * auVar100._0_4_;
              bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
              local_520._4_4_ = (uint)bVar15 * (int)fVar154 | (uint)!bVar15 * auVar100._4_4_;
              bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
              local_520._8_4_ = (uint)bVar15 * (int)fVar155 | (uint)!bVar15 * auVar100._8_4_;
              bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
              local_520._12_4_ = (uint)bVar15 * (int)fVar156 | (uint)!bVar15 * auVar100._12_4_;
              bVar15 = (bool)((byte)(uVar76 >> 4) & 1);
              local_520._16_4_ = (uint)bVar15 * (int)fVar148 | (uint)!bVar15 * auVar100._16_4_;
              bVar15 = (bool)((byte)(uVar76 >> 5) & 1);
              local_520._20_4_ = (uint)bVar15 * (int)fVar86 | (uint)!bVar15 * auVar100._20_4_;
              bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
              local_520._24_4_ = (uint)bVar15 * (int)fVar87 | (uint)!bVar15 * auVar100._24_4_;
              bVar15 = SUB81(uVar76 >> 7,0);
              local_520._28_4_ = (uint)bVar15 * auVar97._28_4_ | (uint)!bVar15 * auVar100._28_4_;
              auVar100 = vsubps_avx(auVar168,auVar68);
              bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
              bVar16 = (bool)((byte)(uVar76 >> 2) & 1);
              bVar17 = (bool)((byte)(uVar76 >> 3) & 1);
              bVar18 = (bool)((byte)(uVar76 >> 4) & 1);
              bVar19 = (bool)((byte)(uVar76 >> 5) & 1);
              bVar20 = (bool)((byte)(uVar76 >> 6) & 1);
              bVar21 = SUB81(uVar76 >> 7,0);
              local_1e0._4_4_ = (uint)bVar15 * (int)fVar161 | (uint)!bVar15 * auVar100._4_4_;
              local_1e0._0_4_ =
                   (uint)(bVar78 & 1) * (int)fVar141 | (uint)!(bool)(bVar78 & 1) * auVar100._0_4_;
              local_1e0._8_4_ = (uint)bVar16 * (int)fVar162 | (uint)!bVar16 * auVar100._8_4_;
              local_1e0._12_4_ = (uint)bVar17 * (int)fVar163 | (uint)!bVar17 * auVar100._12_4_;
              local_1e0._16_4_ = (uint)bVar18 * (int)fVar130 | (uint)!bVar18 * auVar100._16_4_;
              local_1e0._20_4_ = (uint)bVar19 * (int)fVar131 | (uint)!bVar19 * auVar100._20_4_;
              local_1e0._24_4_ = (uint)bVar20 * (int)fVar132 | (uint)!bVar20 * auVar100._24_4_;
              local_1e0._28_4_ = (uint)bVar21 * auVar98._28_4_ | (uint)!bVar21 * auVar100._28_4_;
              local_540 = auVar99;
            }
            if (local_270 != 0) {
              auVar100 = vsubps_avx(auVar105,auVar94);
              auVar90 = vfmadd213ps_fma(auVar100,local_520,auVar94);
              fVar149 = local_628->depth_scale;
              auVar31._4_4_ = fVar149;
              auVar31._0_4_ = fVar149;
              auVar31._8_4_ = fVar149;
              auVar31._12_4_ = fVar149;
              auVar31._16_4_ = fVar149;
              auVar31._20_4_ = fVar149;
              auVar31._24_4_ = fVar149;
              auVar31._28_4_ = fVar149;
              auVar100 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar90._12_4_ + auVar90._12_4_,
                                                            CONCAT48(auVar90._8_4_ + auVar90._8_4_,
                                                                     CONCAT44(auVar90._4_4_ +
                                                                              auVar90._4_4_,
                                                                              auVar90._0_4_ +
                                                                              auVar90._0_4_)))),
                                         auVar31);
              uVar22 = vcmpps_avx512vl(local_540,auVar100,6);
              local_270 = local_270 & (byte)uVar22;
              if (local_270 != 0) {
                auVar139._8_4_ = 0xbf800000;
                auVar139._0_8_ = 0xbf800000bf800000;
                auVar139._12_4_ = 0xbf800000;
                auVar139._16_4_ = 0xbf800000;
                auVar139._20_4_ = 0xbf800000;
                auVar139._24_4_ = 0xbf800000;
                auVar139._28_4_ = 0xbf800000;
                auVar32._8_4_ = 0x40000000;
                auVar32._0_8_ = 0x4000000040000000;
                auVar32._12_4_ = 0x40000000;
                auVar32._16_4_ = 0x40000000;
                auVar32._20_4_ = 0x40000000;
                auVar32._24_4_ = 0x40000000;
                auVar32._28_4_ = 0x40000000;
                local_300 = vfmadd132ps_avx512vl(local_1e0,auVar139,auVar32);
                local_1e0 = local_300;
                auVar100 = local_1e0;
                local_2c0 = (undefined4)lVar81;
                local_2b0 = local_570._0_8_;
                uStack_2a8 = local_570._8_8_;
                local_2a0 = local_390._0_8_;
                uStack_298 = local_390._8_8_;
                local_290 = local_3a0._0_8_;
                uStack_288 = local_3a0._8_8_;
                local_280 = local_3b0._0_8_;
                uStack_278 = local_3b0._8_8_;
                pGVar13 = (local_630->scene->geometries).items[local_608].ptr;
                local_600._0_8_ = pGVar13;
                if ((pGVar13->mask & ray->mask) == 0) {
                  bVar78 = 0;
                }
                else if ((local_630->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar78 = 1, pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_160 = vmovdqa64_avx512vl(auVar184._0_32_);
                  auVar90 = vcvtsi2ss_avx512f(auVar183._0_16_,local_2c0);
                  fVar149 = auVar90._0_4_;
                  local_260[0] = (fVar149 + local_520._0_4_ + 0.0) * (float)local_200;
                  local_260[1] = (fVar149 + local_520._4_4_ + 1.0) * local_200._4_4_;
                  local_260[2] = (fVar149 + local_520._8_4_ + 2.0) * fStack_1f8;
                  local_260[3] = (fVar149 + local_520._12_4_ + 3.0) * fStack_1f4;
                  fStack_250 = (fVar149 + local_520._16_4_ + 4.0) * fStack_1f0;
                  fStack_24c = (fVar149 + local_520._20_4_ + 5.0) * fStack_1ec;
                  fStack_248 = (fVar149 + local_520._24_4_ + 6.0) * fStack_1e8;
                  fStack_244 = fVar149 + local_520._28_4_ + 7.0;
                  local_1e0._0_8_ = local_300._0_8_;
                  local_1e0._8_8_ = local_300._8_8_;
                  local_1e0._16_8_ = local_300._16_8_;
                  local_1e0._24_8_ = local_300._24_8_;
                  local_240 = local_1e0._0_8_;
                  uStack_238 = local_1e0._8_8_;
                  uStack_230 = local_1e0._16_8_;
                  uStack_228 = local_1e0._24_8_;
                  local_220 = local_540;
                  local_560 = local_390._0_4_;
                  fStack_55c = local_390._4_4_;
                  fStack_558 = local_390._8_4_;
                  fStack_554 = local_390._12_4_;
                  uVar76 = 0;
                  local_618 = (ulong)local_270;
                  for (uVar79 = local_618; (uVar79 & 1) == 0;
                      uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                    uVar76 = uVar76 + 1;
                  }
                  local_170 = local_3a0._0_8_;
                  uStack_168 = local_3a0._8_8_;
                  local_180 = local_3b0._0_8_;
                  uStack_178 = local_3b0._8_8_;
                  local_580 = 1;
                  local_320 = local_520;
                  local_2e0 = local_540;
                  local_2bc = iVar12;
                  local_1e0 = auVar100;
                  do {
                    local_5b4 = local_260[uVar76];
                    local_5b0 = *(undefined4 *)((long)&local_240 + uVar76 * 4);
                    local_550 = ray->tfar;
                    ray->tfar = *(float *)(local_220 + uVar76 * 4);
                    local_5f0.context = local_630->user;
                    fVar141 = 1.0 - local_5b4;
                    fVar149 = fVar141 * fVar141 * -3.0;
                    auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar141 * fVar141)),
                                              ZEXT416((uint)(local_5b4 * fVar141)),
                                              ZEXT416(0xc0000000));
                    auVar88 = vfmsub132ss_fma(ZEXT416((uint)(local_5b4 * fVar141)),
                                              ZEXT416((uint)(local_5b4 * local_5b4)),
                                              ZEXT416(0x40000000));
                    fVar141 = auVar90._0_4_ * 3.0;
                    fVar161 = auVar88._0_4_ * 3.0;
                    fVar162 = local_5b4 * local_5b4 * 3.0;
                    auVar165._0_4_ = fVar162 * (float)local_180;
                    auVar165._4_4_ = fVar162 * local_180._4_4_;
                    auVar165._8_4_ = fVar162 * (float)uStack_178;
                    auVar165._12_4_ = fVar162 * uStack_178._4_4_;
                    auVar146._4_4_ = fVar161;
                    auVar146._0_4_ = fVar161;
                    auVar146._8_4_ = fVar161;
                    auVar146._12_4_ = fVar161;
                    auVar75._8_8_ = uStack_168;
                    auVar75._0_8_ = local_170;
                    auVar90 = vfmadd132ps_fma(auVar146,auVar165,auVar75);
                    auVar151._4_4_ = fVar141;
                    auVar151._0_4_ = fVar141;
                    auVar151._8_4_ = fVar141;
                    auVar151._12_4_ = fVar141;
                    auVar71._4_4_ = fStack_55c;
                    auVar71._0_4_ = local_560;
                    auVar71._8_4_ = fStack_558;
                    auVar71._12_4_ = fStack_554;
                    auVar90 = vfmadd132ps_fma(auVar151,auVar90,auVar71);
                    auVar147._4_4_ = fVar149;
                    auVar147._0_4_ = fVar149;
                    auVar147._8_4_ = fVar149;
                    auVar147._12_4_ = fVar149;
                    auVar90 = vfmadd132ps_fma(auVar147,auVar90,local_570);
                    local_5c0 = vmovlps_avx(auVar90);
                    local_5b8 = vextractps_avx(auVar90,2);
                    local_5ac = (undefined4)local_588;
                    local_5a8 = (undefined4)local_608;
                    local_5a4 = (local_5f0.context)->instID[0];
                    local_5a0 = (local_5f0.context)->instPrimID[0];
                    local_634 = -1;
                    local_5f0.valid = &local_634;
                    local_5f0.geometryUserPtr = *(void **)(local_600._0_8_ + 0x18);
                    local_5f0.hit = (RTCHitN *)&local_5c0;
                    local_5f0.N = 1;
                    local_610 = uVar76;
                    local_5f0.ray = (RTCRayN *)ray;
                    if ((*(code **)(local_600._0_8_ + 0x48) == (code *)0x0) ||
                       ((**(code **)(local_600._0_8_ + 0x48))(&local_5f0), *local_5f0.valid != 0)) {
                      auVar90 = auVar183._0_16_;
                      p_Var14 = local_630->args->filter;
                      if (p_Var14 == (RTCFilterFunctionN)0x0) break;
                      if (((local_630->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                         ((*(byte *)(local_600._0_8_ + 0x3e) & 0x40) != 0)) {
                        (*p_Var14)(&local_5f0);
                      }
                      auVar90 = auVar183._0_16_;
                      if (*local_5f0.valid != 0) break;
                    }
                    auVar90 = auVar183._0_16_;
                    ray->tfar = local_550;
                    uVar76 = 0;
                    local_618 = local_618 ^ 1L << (local_610 & 0x3f);
                    for (uVar79 = local_618; (uVar79 & 1) == 0;
                        uVar79 = uVar79 >> 1 | 0x8000000000000000) {
                      uVar76 = uVar76 + 1;
                    }
                    local_580 = (undefined4)CONCAT71((int7)(local_610 >> 8),local_618 != 0);
                  } while (local_618 != 0);
                  bVar78 = (byte)local_580 & 1;
                  auVar90 = vxorps_avx512vl(auVar90,auVar90);
                  auVar183 = ZEXT1664(auVar90);
                  auVar186 = ZEXT3264(local_3e0);
                  auVar193 = ZEXT3264(local_340);
                  auVar185 = ZEXT3264(local_400);
                  auVar181 = ZEXT3264(local_420);
                  auVar187 = ZEXT3264(local_480);
                  auVar188 = ZEXT3264(local_4a0);
                  auVar189 = ZEXT3264(local_4c0);
                  auVar190 = ZEXT3264(local_4e0);
                  auVar191 = ZEXT3264(local_360);
                  auVar192 = ZEXT3264(local_380);
                  auVar100 = vmovdqa64_avx512vl(local_160);
                  auVar184 = ZEXT3264(auVar100);
                }
                bVar84 = (bool)(bVar84 | bVar78);
              }
            }
          }
          lVar81 = lVar81 + 8;
        } while ((int)lVar81 < iVar12);
      }
      if (bVar84 != false) {
        return bVar85;
      }
      fVar149 = ray->tfar;
      auVar28._4_4_ = fVar149;
      auVar28._0_4_ = fVar149;
      auVar28._8_4_ = fVar149;
      auVar28._12_4_ = fVar149;
      auVar28._16_4_ = fVar149;
      auVar28._20_4_ = fVar149;
      auVar28._24_4_ = fVar149;
      auVar28._28_4_ = fVar149;
      uVar22 = vcmpps_avx512vl(local_80,auVar28,2);
      uVar83 = (uint)uVar82 & (uint)uVar82 + 0xff & (uint)uVar22;
      uVar82 = (ulong)uVar83;
      bVar85 = uVar83 != 0;
      context = local_630;
      prim = local_620;
      pre = local_628;
    } while (bVar85);
  }
  return bVar85;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }